

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  bool bVar82;
  long lVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  uint uVar100;
  long lVar101;
  ulong uVar102;
  bool bVar103;
  float fVar104;
  float fVar130;
  float fVar132;
  __m128 a;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar139;
  float fVar176;
  float fVar177;
  undefined1 auVar140 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar141 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar178;
  undefined1 auVar142 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar179;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar214;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [28];
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar217;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar218;
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar233;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar228 [32];
  float fVar234;
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [32];
  float fVar245;
  float fVar265;
  float fVar266;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar251 [32];
  float fVar267;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar271;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar272;
  undefined1 auVar275 [16];
  float fVar285;
  float fVar286;
  float fVar292;
  float fVar296;
  float fVar300;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar293;
  float fVar294;
  float fVar297;
  float fVar298;
  float fVar301;
  float fVar302;
  float fVar304;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar287;
  float fVar291;
  float fVar295;
  float fVar299;
  float fVar303;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  float fVar305;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar321;
  float fVar322;
  float fVar331;
  float fVar333;
  float fVar337;
  float fVar339;
  float fVar341;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar338;
  float fVar340;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar351;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar352;
  float fVar353;
  undefined1 auVar349 [32];
  undefined1 auVar350 [64];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  float fVar358;
  float fVar365;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar367;
  float fVar371;
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  float fVar372;
  float fVar373;
  float fVar378;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float in_register_0000151c;
  undefined1 auVar374 [32];
  float fVar385;
  undefined1 auVar375 [32];
  float fVar379;
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  float fVar386;
  float fVar387;
  undefined1 auVar388 [16];
  float fVar391;
  float fVar393;
  float fVar397;
  float fVar399;
  float fVar401;
  undefined1 auVar389 [32];
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar398;
  float fVar400;
  float fVar402;
  undefined1 auVar390 [32];
  undefined1 auVar403 [16];
  float in_register_0000159c;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  float in_register_000015dc;
  undefined1 auVar408 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  ulong local_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined8 local_900;
  float local_8f8;
  float local_8f4;
  undefined4 local_8f0;
  uint local_8ec;
  uint local_8e8;
  uint local_8e4;
  uint local_8e0;
  Primitive *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar12 = prim[1];
  uVar97 = (ulong)(byte)PVar12;
  lVar101 = uVar97 * 5;
  lVar83 = uVar97 * 0x19;
  fVar198 = *(float *)(prim + lVar83 + 0x12);
  auVar181 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar83 + 6));
  auVar246._0_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar246._4_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar246._8_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar246._12_4_ = fVar198 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 10)));
  auVar140._0_4_ = fVar198 * auVar181._0_4_;
  auVar140._4_4_ = fVar198 * auVar181._4_4_;
  auVar140._8_4_ = fVar198 * auVar181._8_4_;
  auVar140._12_4_ = fVar198 * auVar181._12_4_;
  auVar123._16_16_ = auVar109;
  auVar123._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar101 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar101 + 10)));
  auVar190._16_16_ = auVar109;
  auVar190._0_16_ = auVar146;
  auVar159 = vcvtdq2ps_avx(auVar190);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 10)));
  auVar205._16_16_ = auVar109;
  auVar205._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 10)));
  auVar17 = vcvtdq2ps_avx(auVar205);
  auVar206._16_16_ = auVar109;
  auVar206._0_16_ = auVar146;
  auVar18 = vcvtdq2ps_avx(auVar206);
  uVar99 = (ulong)((uint)(byte)PVar12 * 0xc);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 10)));
  auVar276._16_16_ = auVar109;
  auVar276._0_16_ = auVar146;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar97 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar276);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar97 + 10)));
  auVar306._16_16_ = auVar109;
  auVar306._0_16_ = auVar146;
  lVar16 = uVar97 * 9;
  uVar99 = (ulong)(uint)((int)lVar16 * 2);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar162 = vcvtdq2ps_avx(auVar306);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 10)));
  auVar307._16_16_ = auVar109;
  auVar307._0_16_ = auVar146;
  auVar327 = vcvtdq2ps_avx(auVar307);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar97 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar97 + 10)));
  auVar347._16_16_ = auVar109;
  auVar347._0_16_ = auVar146;
  uVar99 = (ulong)(uint)((int)lVar101 << 2);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar347);
  auVar355._16_16_ = auVar109;
  auVar355._0_16_ = auVar146;
  auVar20 = vcvtdq2ps_avx(auVar355);
  auVar146 = vshufps_avx(auVar246,auVar246,0);
  auVar109 = vshufps_avx(auVar246,auVar246,0x55);
  auVar181 = vshufps_avx(auVar246,auVar246,0xaa);
  fVar198 = auVar181._0_4_;
  fVar212 = auVar181._4_4_;
  fVar213 = auVar181._8_4_;
  fVar214 = auVar181._12_4_;
  fVar215 = auVar109._0_4_;
  fVar216 = auVar109._4_4_;
  fVar217 = auVar109._8_4_;
  fVar218 = auVar109._12_4_;
  fVar233 = auVar146._0_4_;
  fVar235 = auVar146._4_4_;
  fVar237 = auVar146._8_4_;
  fVar239 = auVar146._12_4_;
  auVar374._0_4_ = fVar233 * auVar123._0_4_ + fVar215 * auVar159._0_4_ + fVar198 * auVar17._0_4_;
  auVar374._4_4_ = fVar235 * auVar123._4_4_ + fVar216 * auVar159._4_4_ + fVar212 * auVar17._4_4_;
  auVar374._8_4_ = fVar237 * auVar123._8_4_ + fVar217 * auVar159._8_4_ + fVar213 * auVar17._8_4_;
  auVar374._12_4_ = fVar239 * auVar123._12_4_ + fVar218 * auVar159._12_4_ + fVar214 * auVar17._12_4_
  ;
  auVar374._16_4_ = fVar233 * auVar123._16_4_ + fVar215 * auVar159._16_4_ + fVar198 * auVar17._16_4_
  ;
  auVar374._20_4_ = fVar235 * auVar123._20_4_ + fVar216 * auVar159._20_4_ + fVar212 * auVar17._20_4_
  ;
  auVar374._24_4_ = fVar237 * auVar123._24_4_ + fVar217 * auVar159._24_4_ + fVar213 * auVar17._24_4_
  ;
  auVar374._28_4_ = fVar218 + in_register_000015dc + in_register_0000151c;
  auVar361._0_4_ = fVar233 * auVar18._0_4_ + fVar215 * auVar160._0_4_ + auVar162._0_4_ * fVar198;
  auVar361._4_4_ = fVar235 * auVar18._4_4_ + fVar216 * auVar160._4_4_ + auVar162._4_4_ * fVar212;
  auVar361._8_4_ = fVar237 * auVar18._8_4_ + fVar217 * auVar160._8_4_ + auVar162._8_4_ * fVar213;
  auVar361._12_4_ = fVar239 * auVar18._12_4_ + fVar218 * auVar160._12_4_ + auVar162._12_4_ * fVar214
  ;
  auVar361._16_4_ = fVar233 * auVar18._16_4_ + fVar215 * auVar160._16_4_ + auVar162._16_4_ * fVar198
  ;
  auVar361._20_4_ = fVar235 * auVar18._20_4_ + fVar216 * auVar160._20_4_ + auVar162._20_4_ * fVar212
  ;
  auVar361._24_4_ = fVar237 * auVar18._24_4_ + fVar217 * auVar160._24_4_ + auVar162._24_4_ * fVar213
  ;
  auVar361._28_4_ = fVar218 + in_register_000015dc + in_register_0000159c;
  auVar251._0_4_ = fVar233 * auVar327._0_4_ + fVar215 * auVar19._0_4_ + auVar20._0_4_ * fVar198;
  auVar251._4_4_ = fVar235 * auVar327._4_4_ + fVar216 * auVar19._4_4_ + auVar20._4_4_ * fVar212;
  auVar251._8_4_ = fVar237 * auVar327._8_4_ + fVar217 * auVar19._8_4_ + auVar20._8_4_ * fVar213;
  auVar251._12_4_ = fVar239 * auVar327._12_4_ + fVar218 * auVar19._12_4_ + auVar20._12_4_ * fVar214;
  auVar251._16_4_ = fVar233 * auVar327._16_4_ + fVar215 * auVar19._16_4_ + auVar20._16_4_ * fVar198;
  auVar251._20_4_ = fVar235 * auVar327._20_4_ + fVar216 * auVar19._20_4_ + auVar20._20_4_ * fVar212;
  auVar251._24_4_ = fVar237 * auVar327._24_4_ + fVar217 * auVar19._24_4_ + auVar20._24_4_ * fVar213;
  auVar251._28_4_ = fVar239 + fVar218 + fVar214;
  auVar146 = vshufps_avx(auVar140,auVar140,0);
  auVar109 = vshufps_avx(auVar140,auVar140,0x55);
  auVar181 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar212 = auVar181._0_4_;
  fVar213 = auVar181._4_4_;
  fVar214 = auVar181._8_4_;
  fVar215 = auVar181._12_4_;
  fVar235 = auVar109._0_4_;
  fVar237 = auVar109._4_4_;
  fVar239 = auVar109._8_4_;
  fVar241 = auVar109._12_4_;
  fVar216 = auVar146._0_4_;
  fVar217 = auVar146._4_4_;
  fVar218 = auVar146._8_4_;
  fVar233 = auVar146._12_4_;
  fVar198 = auVar123._28_4_;
  auVar277._0_4_ = fVar216 * auVar123._0_4_ + fVar235 * auVar159._0_4_ + fVar212 * auVar17._0_4_;
  auVar277._4_4_ = fVar217 * auVar123._4_4_ + fVar237 * auVar159._4_4_ + fVar213 * auVar17._4_4_;
  auVar277._8_4_ = fVar218 * auVar123._8_4_ + fVar239 * auVar159._8_4_ + fVar214 * auVar17._8_4_;
  auVar277._12_4_ = fVar233 * auVar123._12_4_ + fVar241 * auVar159._12_4_ + fVar215 * auVar17._12_4_
  ;
  auVar277._16_4_ = fVar216 * auVar123._16_4_ + fVar235 * auVar159._16_4_ + fVar212 * auVar17._16_4_
  ;
  auVar277._20_4_ = fVar217 * auVar123._20_4_ + fVar237 * auVar159._20_4_ + fVar213 * auVar17._20_4_
  ;
  auVar277._24_4_ = fVar218 * auVar123._24_4_ + fVar239 * auVar159._24_4_ + fVar214 * auVar17._24_4_
  ;
  auVar277._28_4_ = fVar198 + auVar159._28_4_ + auVar17._28_4_;
  auVar154._0_4_ = fVar216 * auVar18._0_4_ + auVar162._0_4_ * fVar212 + fVar235 * auVar160._0_4_;
  auVar154._4_4_ = fVar217 * auVar18._4_4_ + auVar162._4_4_ * fVar213 + fVar237 * auVar160._4_4_;
  auVar154._8_4_ = fVar218 * auVar18._8_4_ + auVar162._8_4_ * fVar214 + fVar239 * auVar160._8_4_;
  auVar154._12_4_ = fVar233 * auVar18._12_4_ + auVar162._12_4_ * fVar215 + fVar241 * auVar160._12_4_
  ;
  auVar154._16_4_ = fVar216 * auVar18._16_4_ + auVar162._16_4_ * fVar212 + fVar235 * auVar160._16_4_
  ;
  auVar154._20_4_ = fVar217 * auVar18._20_4_ + auVar162._20_4_ * fVar213 + fVar237 * auVar160._20_4_
  ;
  auVar154._24_4_ = fVar218 * auVar18._24_4_ + auVar162._24_4_ * fVar214 + fVar239 * auVar160._24_4_
  ;
  auVar154._28_4_ = fVar198 + auVar162._28_4_ + auVar17._28_4_;
  auVar308._8_4_ = 0x7fffffff;
  auVar308._0_8_ = 0x7fffffff7fffffff;
  auVar308._12_4_ = 0x7fffffff;
  auVar308._16_4_ = 0x7fffffff;
  auVar308._20_4_ = 0x7fffffff;
  auVar308._24_4_ = 0x7fffffff;
  auVar308._28_4_ = 0x7fffffff;
  auVar348._8_4_ = 0x219392ef;
  auVar348._0_8_ = 0x219392ef219392ef;
  auVar348._12_4_ = 0x219392ef;
  auVar348._16_4_ = 0x219392ef;
  auVar348._20_4_ = 0x219392ef;
  auVar348._24_4_ = 0x219392ef;
  auVar348._28_4_ = 0x219392ef;
  auVar123 = vandps_avx(auVar374,auVar308);
  auVar123 = vcmpps_avx(auVar123,auVar348,1);
  auVar159 = vblendvps_avx(auVar374,auVar348,auVar123);
  auVar123 = vandps_avx(auVar361,auVar308);
  auVar123 = vcmpps_avx(auVar123,auVar348,1);
  auVar17 = vblendvps_avx(auVar361,auVar348,auVar123);
  auVar123 = vandps_avx(auVar251,auVar308);
  auVar123 = vcmpps_avx(auVar123,auVar348,1);
  auVar123 = vblendvps_avx(auVar251,auVar348,auVar123);
  auVar191._0_4_ = fVar235 * auVar19._0_4_ + auVar20._0_4_ * fVar212 + fVar216 * auVar327._0_4_;
  auVar191._4_4_ = fVar237 * auVar19._4_4_ + auVar20._4_4_ * fVar213 + fVar217 * auVar327._4_4_;
  auVar191._8_4_ = fVar239 * auVar19._8_4_ + auVar20._8_4_ * fVar214 + fVar218 * auVar327._8_4_;
  auVar191._12_4_ = fVar241 * auVar19._12_4_ + auVar20._12_4_ * fVar215 + fVar233 * auVar327._12_4_;
  auVar191._16_4_ = fVar235 * auVar19._16_4_ + auVar20._16_4_ * fVar212 + fVar216 * auVar327._16_4_;
  auVar191._20_4_ = fVar237 * auVar19._20_4_ + auVar20._20_4_ * fVar213 + fVar217 * auVar327._20_4_;
  auVar191._24_4_ = fVar239 * auVar19._24_4_ + auVar20._24_4_ * fVar214 + fVar218 * auVar327._24_4_;
  auVar191._28_4_ = auVar160._28_4_ + fVar215 + fVar198;
  auVar18 = vrcpps_avx(auVar159);
  fVar198 = auVar18._0_4_;
  fVar212 = auVar18._4_4_;
  auVar160._4_4_ = auVar159._4_4_ * fVar212;
  auVar160._0_4_ = auVar159._0_4_ * fVar198;
  fVar213 = auVar18._8_4_;
  auVar160._8_4_ = auVar159._8_4_ * fVar213;
  fVar214 = auVar18._12_4_;
  auVar160._12_4_ = auVar159._12_4_ * fVar214;
  fVar215 = auVar18._16_4_;
  auVar160._16_4_ = auVar159._16_4_ * fVar215;
  fVar216 = auVar18._20_4_;
  auVar160._20_4_ = auVar159._20_4_ * fVar216;
  fVar217 = auVar18._24_4_;
  auVar160._24_4_ = auVar159._24_4_ * fVar217;
  auVar160._28_4_ = auVar159._28_4_;
  auVar325._8_4_ = 0x3f800000;
  auVar325._0_8_ = &DAT_3f8000003f800000;
  auVar325._12_4_ = 0x3f800000;
  auVar325._16_4_ = 0x3f800000;
  auVar325._20_4_ = 0x3f800000;
  auVar325._24_4_ = 0x3f800000;
  auVar325._28_4_ = 0x3f800000;
  auVar160 = vsubps_avx(auVar325,auVar160);
  auVar159 = vrcpps_avx(auVar17);
  fVar198 = fVar198 + fVar198 * auVar160._0_4_;
  fVar212 = fVar212 + fVar212 * auVar160._4_4_;
  fVar213 = fVar213 + fVar213 * auVar160._8_4_;
  fVar214 = fVar214 + fVar214 * auVar160._12_4_;
  fVar215 = fVar215 + fVar215 * auVar160._16_4_;
  fVar216 = fVar216 + fVar216 * auVar160._20_4_;
  fVar217 = fVar217 + fVar217 * auVar160._24_4_;
  fVar245 = auVar159._0_4_;
  fVar265 = auVar159._4_4_;
  auVar162._4_4_ = fVar265 * auVar17._4_4_;
  auVar162._0_4_ = fVar245 * auVar17._0_4_;
  fVar266 = auVar159._8_4_;
  auVar162._8_4_ = fVar266 * auVar17._8_4_;
  fVar267 = auVar159._12_4_;
  auVar162._12_4_ = fVar267 * auVar17._12_4_;
  fVar268 = auVar159._16_4_;
  auVar162._16_4_ = fVar268 * auVar17._16_4_;
  fVar269 = auVar159._20_4_;
  auVar162._20_4_ = fVar269 * auVar17._20_4_;
  fVar270 = auVar159._24_4_;
  auVar162._24_4_ = fVar270 * auVar17._24_4_;
  auVar162._28_4_ = auVar18._28_4_;
  auVar159 = vsubps_avx(auVar325,auVar162);
  fVar245 = fVar245 + fVar245 * auVar159._0_4_;
  fVar265 = fVar265 + fVar265 * auVar159._4_4_;
  fVar266 = fVar266 + fVar266 * auVar159._8_4_;
  fVar267 = fVar267 + fVar267 * auVar159._12_4_;
  fVar268 = fVar268 + fVar268 * auVar159._16_4_;
  fVar269 = fVar269 + fVar269 * auVar159._20_4_;
  fVar270 = fVar270 + fVar270 * auVar159._24_4_;
  auVar159 = vrcpps_avx(auVar123);
  fVar218 = auVar159._0_4_;
  fVar233 = auVar159._4_4_;
  auVar327._4_4_ = fVar233 * auVar123._4_4_;
  auVar327._0_4_ = fVar218 * auVar123._0_4_;
  fVar235 = auVar159._8_4_;
  auVar327._8_4_ = fVar235 * auVar123._8_4_;
  fVar237 = auVar159._12_4_;
  auVar327._12_4_ = fVar237 * auVar123._12_4_;
  fVar239 = auVar159._16_4_;
  auVar327._16_4_ = fVar239 * auVar123._16_4_;
  fVar241 = auVar159._20_4_;
  auVar327._20_4_ = fVar241 * auVar123._20_4_;
  fVar243 = auVar159._24_4_;
  auVar327._24_4_ = fVar243 * auVar123._24_4_;
  auVar327._28_4_ = auVar17._28_4_;
  auVar123 = vsubps_avx(auVar325,auVar327);
  fVar218 = fVar218 + fVar218 * auVar123._0_4_;
  fVar233 = fVar233 + fVar233 * auVar123._4_4_;
  fVar235 = fVar235 + fVar235 * auVar123._8_4_;
  fVar237 = fVar237 + fVar237 * auVar123._12_4_;
  fVar239 = fVar239 + fVar239 * auVar123._16_4_;
  fVar241 = fVar241 + fVar241 * auVar123._20_4_;
  fVar243 = fVar243 + fVar243 * auVar123._24_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar97 * 7 + 0xe);
  auVar109 = vpmovsxwd_avx(auVar109);
  auVar117._16_16_ = auVar109;
  auVar117._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar117);
  auVar123 = vsubps_avx(auVar123,auVar277);
  auVar105._0_4_ = fVar198 * auVar123._0_4_;
  auVar105._4_4_ = fVar212 * auVar123._4_4_;
  auVar105._8_4_ = fVar213 * auVar123._8_4_;
  auVar105._12_4_ = fVar214 * auVar123._12_4_;
  auVar17._16_4_ = fVar215 * auVar123._16_4_;
  auVar17._0_16_ = auVar105;
  auVar17._20_4_ = fVar216 * auVar123._20_4_;
  auVar17._24_4_ = fVar217 * auVar123._24_4_;
  auVar17._28_4_ = auVar123._28_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + lVar16 + 6);
  auVar146 = vpmovsxwd_avx(auVar181);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + lVar16 + 0xe);
  auVar109 = vpmovsxwd_avx(auVar143);
  auVar309._16_16_ = auVar109;
  auVar309._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar309);
  auVar123 = vsubps_avx(auVar123,auVar277);
  auVar199._0_4_ = fVar198 * auVar123._0_4_;
  auVar199._4_4_ = fVar212 * auVar123._4_4_;
  auVar199._8_4_ = fVar213 * auVar123._8_4_;
  auVar199._12_4_ = fVar214 * auVar123._12_4_;
  auVar19._16_4_ = fVar215 * auVar123._16_4_;
  auVar19._0_16_ = auVar199;
  auVar19._20_4_ = fVar216 * auVar123._20_4_;
  auVar19._24_4_ = fVar217 * auVar123._24_4_;
  auVar19._28_4_ = auVar18._28_4_ + auVar160._28_4_;
  lVar101 = (ulong)(byte)PVar12 * 0x10;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + lVar101 + 6);
  auVar146 = vpmovsxwd_avx(auVar108);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar101 + 0xe);
  auVar109 = vpmovsxwd_avx(auVar6);
  lVar101 = lVar101 + uVar97 * -2;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + lVar101 + 6);
  auVar181 = vpmovsxwd_avx(auVar151);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar101 + 0xe);
  auVar143 = vpmovsxwd_avx(auVar7);
  auVar278._16_16_ = auVar143;
  auVar278._0_16_ = auVar181;
  auVar123 = vcvtdq2ps_avx(auVar278);
  auVar123 = vsubps_avx(auVar123,auVar154);
  auVar273._0_4_ = fVar245 * auVar123._0_4_;
  auVar273._4_4_ = fVar265 * auVar123._4_4_;
  auVar273._8_4_ = fVar266 * auVar123._8_4_;
  auVar273._12_4_ = fVar267 * auVar123._12_4_;
  auVar159._16_4_ = fVar268 * auVar123._16_4_;
  auVar159._0_16_ = auVar273;
  auVar159._20_4_ = fVar269 * auVar123._20_4_;
  auVar159._24_4_ = fVar270 * auVar123._24_4_;
  auVar159._28_4_ = auVar123._28_4_;
  auVar310._16_16_ = auVar109;
  auVar310._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar310);
  auVar123 = vsubps_avx(auVar123,auVar154);
  auVar141._0_4_ = fVar245 * auVar123._0_4_;
  auVar141._4_4_ = fVar265 * auVar123._4_4_;
  auVar141._8_4_ = fVar266 * auVar123._8_4_;
  auVar141._12_4_ = fVar267 * auVar123._12_4_;
  auVar18._16_4_ = fVar268 * auVar123._16_4_;
  auVar18._0_16_ = auVar141;
  auVar18._20_4_ = fVar269 * auVar123._20_4_;
  auVar18._24_4_ = fVar270 * auVar123._24_4_;
  auVar18._28_4_ = auVar123._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar99 + uVar97 + 6);
  auVar146 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar99 + uVar97 + 0xe);
  auVar109 = vpmovsxwd_avx(auVar9);
  auVar252._16_16_ = auVar109;
  auVar252._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar252);
  auVar123 = vsubps_avx(auVar123,auVar191);
  auVar247._0_4_ = fVar218 * auVar123._0_4_;
  auVar247._4_4_ = fVar233 * auVar123._4_4_;
  auVar247._8_4_ = fVar235 * auVar123._8_4_;
  auVar247._12_4_ = fVar237 * auVar123._12_4_;
  auVar20._16_4_ = fVar239 * auVar123._16_4_;
  auVar20._0_16_ = auVar247;
  auVar20._20_4_ = fVar241 * auVar123._20_4_;
  auVar20._24_4_ = fVar243 * auVar123._24_4_;
  auVar20._28_4_ = auVar123._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar146 = vpmovsxwd_avx(auVar10);
  local_8c8 = prim;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 0xe);
  auVar109 = vpmovsxwd_avx(auVar11);
  auVar311._16_16_ = auVar109;
  auVar311._0_16_ = auVar146;
  auVar123 = vcvtdq2ps_avx(auVar311);
  auVar123 = vsubps_avx(auVar123,auVar191);
  auVar180._0_4_ = fVar218 * auVar123._0_4_;
  auVar180._4_4_ = fVar233 * auVar123._4_4_;
  auVar180._8_4_ = fVar235 * auVar123._8_4_;
  auVar180._12_4_ = fVar237 * auVar123._12_4_;
  auVar29._16_4_ = fVar239 * auVar123._16_4_;
  auVar29._0_16_ = auVar180;
  auVar29._20_4_ = fVar241 * auVar123._20_4_;
  auVar29._24_4_ = fVar243 * auVar123._24_4_;
  auVar29._28_4_ = auVar123._28_4_;
  auVar146 = vpminsd_avx(auVar17._16_16_,auVar19._16_16_);
  auVar109 = vpminsd_avx(auVar105,auVar199);
  auVar326._16_16_ = auVar146;
  auVar326._0_16_ = auVar109;
  auVar108 = auVar159._16_16_;
  auVar357 = ZEXT1664(auVar108);
  auVar146 = vpminsd_avx(auVar108,auVar18._16_16_);
  auVar109 = vpminsd_avx(auVar273,auVar141);
  auVar362._16_16_ = auVar146;
  auVar362._0_16_ = auVar109;
  auVar123 = vmaxps_avx(auVar326,auVar362);
  auVar181 = auVar29._16_16_;
  auVar364 = ZEXT1664(auVar181);
  auVar143 = auVar20._16_16_;
  auVar377 = ZEXT1664(auVar143);
  auVar146 = vpminsd_avx(auVar143,auVar181);
  auVar109 = vpminsd_avx(auVar247,auVar180);
  auVar389._16_16_ = auVar146;
  auVar389._0_16_ = auVar109;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar404._4_4_ = uVar1;
  auVar404._0_4_ = uVar1;
  auVar404._8_4_ = uVar1;
  auVar404._12_4_ = uVar1;
  auVar404._16_4_ = uVar1;
  auVar404._20_4_ = uVar1;
  auVar404._24_4_ = uVar1;
  auVar404._28_4_ = uVar1;
  auVar159 = vmaxps_avx(auVar389,auVar404);
  auVar123 = vmaxps_avx(auVar123,auVar159);
  local_2a0._4_4_ = auVar123._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar123._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar123._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar123._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar123._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar123._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar123._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar123._28_4_;
  auVar146 = vpmaxsd_avx(auVar17._16_16_,auVar19._16_16_);
  auVar109 = vpmaxsd_avx(auVar105,auVar199);
  auVar118._16_16_ = auVar146;
  auVar118._0_16_ = auVar109;
  auVar146 = vpmaxsd_avx(auVar108,auVar18._16_16_);
  auVar109 = vpmaxsd_avx(auVar273,auVar141);
  auVar155._16_16_ = auVar146;
  auVar155._0_16_ = auVar109;
  auVar123 = vminps_avx(auVar118,auVar155);
  auVar146 = vpmaxsd_avx(auVar143,auVar181);
  auVar109 = vpmaxsd_avx(auVar247,auVar180);
  fVar198 = (ray->super_RayK<1>).tfar;
  auVar207._4_4_ = fVar198;
  auVar207._0_4_ = fVar198;
  auVar207._8_4_ = fVar198;
  auVar207._12_4_ = fVar198;
  auVar207._16_4_ = fVar198;
  auVar207._20_4_ = fVar198;
  auVar207._24_4_ = fVar198;
  auVar207._28_4_ = fVar198;
  auVar156._16_16_ = auVar146;
  auVar156._0_16_ = auVar109;
  auVar159 = vminps_avx(auVar156,auVar207);
  auVar123 = vminps_avx(auVar123,auVar159);
  auVar30._4_4_ = auVar123._4_4_ * 1.0000004;
  auVar30._0_4_ = auVar123._0_4_ * 1.0000004;
  auVar30._8_4_ = auVar123._8_4_ * 1.0000004;
  auVar30._12_4_ = auVar123._12_4_ * 1.0000004;
  auVar30._16_4_ = auVar123._16_4_ * 1.0000004;
  auVar30._20_4_ = auVar123._20_4_ * 1.0000004;
  auVar30._24_4_ = auVar123._24_4_ * 1.0000004;
  auVar30._28_4_ = auVar123._28_4_;
  auVar123 = vcmpps_avx(local_2a0,auVar30,2);
  auVar146 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar157._16_16_ = auVar146;
  auVar157._0_16_ = auVar146;
  auVar159 = vcvtdq2ps_avx(auVar157);
  auVar159 = vcmpps_avx(_DAT_02020f40,auVar159,1);
  auVar123 = vandps_avx(auVar123,auVar159);
  uVar98 = vmovmskps_avx(auVar123);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar119._16_16_ = mm_lookupmask_ps._240_16_;
  auVar119._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar119,ZEXT832(0) << 0x20,0x80);
  local_7b0 = prim + lVar83 + 0x16;
LAB_010e71d1:
  local_7a8 = (ulong)uVar98;
  lVar101 = 0;
  if (local_7a8 != 0) {
    for (; (uVar98 >> lVar101 & 1) == 0; lVar101 = lVar101 + 1) {
    }
  }
  local_7a8 = local_7a8 - 1 & local_7a8;
  uVar98 = *(uint *)(local_8c8 + lVar101 * 4 + 6);
  lVar101 = lVar101 * 0x40;
  lVar16 = 0;
  if (local_7a8 != 0) {
    for (; (local_7a8 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  local_ac8 = (ulong)*(uint *)(local_8c8 + 2);
  auVar146 = *(undefined1 (*) [16])(local_7b0 + lVar101);
  if (((local_7a8 != 0) && (uVar99 = local_7a8 - 1 & local_7a8, uVar99 != 0)) &&
     (lVar16 = 0, uVar99 != 0)) {
    for (; (uVar99 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  auVar109 = *(undefined1 (*) [16])(local_7b0 + lVar101 + 0x10);
  auVar181 = *(undefined1 (*) [16])(local_7b0 + lVar101 + 0x20);
  auVar143 = *(undefined1 (*) [16])(local_7b0 + lVar101 + 0x30);
  auVar106._0_4_ = (auVar146._0_4_ + auVar109._0_4_ + auVar181._0_4_ + auVar143._0_4_) * 0.25;
  auVar106._4_4_ = (auVar146._4_4_ + auVar109._4_4_ + auVar181._4_4_ + auVar143._4_4_) * 0.25;
  auVar106._8_4_ = (auVar146._8_4_ + auVar109._8_4_ + auVar181._8_4_ + auVar143._8_4_) * 0.25;
  auVar106._12_4_ = (auVar146._12_4_ + auVar109._12_4_ + auVar181._12_4_ + auVar143._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar108 = vsubps_avx(auVar106,(undefined1  [16])aVar3);
  auVar108 = vdpps_avx(auVar108,(undefined1  [16])aVar4,0x7f);
  auVar6 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar151 = vrcpss_avx(auVar6,auVar6);
  auVar350 = ZEXT464(0x40000000);
  fVar198 = auVar108._0_4_ * auVar151._0_4_ * (2.0 - auVar151._0_4_ * auVar6._0_4_);
  local_7c0 = ZEXT416((uint)fVar198);
  auVar6 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
  fVar198 = aVar4.x;
  fVar212 = aVar4.y;
  fVar213 = aVar4.z;
  aVar178 = aVar4.field_3;
  auVar274._0_4_ = aVar3.x + fVar198 * auVar6._0_4_;
  auVar274._4_4_ = aVar3.y + fVar212 * auVar6._4_4_;
  auVar274._8_4_ = aVar3.z + fVar213 * auVar6._8_4_;
  auVar274._12_4_ = aVar3.field_3.w + aVar178.w * auVar6._12_4_;
  auVar108 = vblendps_avx(auVar274,_DAT_01feba10,8);
  _local_970 = vsubps_avx(auVar146,auVar108);
  _local_980 = vsubps_avx(auVar181,auVar108);
  _local_990 = vsubps_avx(auVar109,auVar108);
  _local_9a0 = vsubps_avx(auVar143,auVar108);
  auVar146 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar146;
  _local_1a0 = auVar146;
  auVar146 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar146;
  _local_1c0 = auVar146;
  auVar146 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar146;
  _local_1e0 = auVar146;
  auVar146 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001290 = auVar146;
  _local_2c0 = auVar146;
  auVar146 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar146;
  _local_200 = auVar146;
  auVar146 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar146;
  _local_220 = auVar146;
  auVar146 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar146;
  _local_240 = auVar146;
  auVar142._0_4_ = fVar198 * fVar198;
  auVar142._4_4_ = fVar212 * fVar212;
  auVar142._8_4_ = fVar213 * fVar213;
  auVar142._12_4_ = aVar178.w * aVar178.w;
  auVar146 = vshufps_avx(auVar142,auVar142,0xaa);
  auVar109 = vshufps_avx(auVar142,auVar142,0x55);
  auVar181 = vshufps_avx(_local_990,_local_990,0xff);
  register0x000012d0 = auVar181;
  _local_2e0 = auVar181;
  auVar181 = vshufps_avx(auVar142,auVar142,0);
  local_260._0_4_ = auVar181._0_4_ + auVar109._0_4_ + auVar146._0_4_;
  local_260._4_4_ = auVar181._4_4_ + auVar109._4_4_ + auVar146._4_4_;
  local_260._8_4_ = auVar181._8_4_ + auVar109._8_4_ + auVar146._8_4_;
  local_260._12_4_ = auVar181._12_4_ + auVar109._12_4_ + auVar146._12_4_;
  local_260._16_4_ = auVar181._0_4_ + auVar109._0_4_ + auVar146._0_4_;
  local_260._20_4_ = auVar181._4_4_ + auVar109._4_4_ + auVar146._4_4_;
  local_260._24_4_ = auVar181._8_4_ + auVar109._8_4_ + auVar146._8_4_;
  local_260._28_4_ = auVar181._12_4_ + auVar109._12_4_ + auVar146._12_4_;
  auVar146 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar146;
  _local_300 = auVar146;
  auVar146 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar146;
  _local_320 = auVar146;
  auVar146 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar146;
  _local_340 = auVar146;
  auVar146 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar146;
  _local_360 = auVar146;
  auVar146 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar146;
  _local_380 = auVar146;
  auVar146 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar146;
  _local_3a0 = auVar146;
  auVar146 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar146;
  _local_3c0 = auVar146;
  auVar146 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar146;
  _local_3e0 = auVar146;
  register0x00001390 = auVar6;
  _local_820 = auVar6;
  auVar284 = ZEXT3264(_local_820);
  uVar99 = 1;
  uVar97 = 0;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_540 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  local_400 = vandps_avx(local_260,auVar120);
  auVar314 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar264 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    local_910 = auVar314._0_16_;
    auVar146 = vmovshdup_avx(local_910);
    fVar218 = auVar146._0_4_ - auVar314._0_4_;
    auVar146 = vshufps_avx(local_910,local_910,0);
    local_860._16_16_ = auVar146;
    local_860._0_16_ = auVar146;
    auVar109 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
    local_800._16_16_ = auVar109;
    local_800._0_16_ = auVar109;
    fVar139 = auVar109._0_4_;
    fVar176 = auVar109._4_4_;
    fVar177 = auVar109._8_4_;
    fVar179 = auVar109._12_4_;
    fVar104 = auVar146._0_4_;
    auVar208._0_4_ = fVar104 + fVar139 * 0.0;
    fVar130 = auVar146._4_4_;
    auVar208._4_4_ = fVar130 + fVar176 * 0.14285715;
    fVar132 = auVar146._8_4_;
    auVar208._8_4_ = fVar132 + fVar177 * 0.2857143;
    fVar134 = auVar146._12_4_;
    auVar208._12_4_ = fVar134 + fVar179 * 0.42857146;
    auVar208._16_4_ = fVar104 + fVar139 * 0.5714286;
    auVar208._20_4_ = fVar130 + fVar176 * 0.71428573;
    auVar208._24_4_ = fVar132 + fVar177 * 0.8571429;
    auVar208._28_4_ = fVar134 + fVar179;
    auVar123 = vsubps_avx(auVar264._0_32_,auVar208);
    fVar198 = auVar123._0_4_;
    fVar212 = auVar123._4_4_;
    fVar213 = auVar123._8_4_;
    fVar214 = auVar123._12_4_;
    fVar215 = auVar123._16_4_;
    fVar216 = auVar123._20_4_;
    fVar217 = auVar123._24_4_;
    fVar235 = fVar198 * fVar198 * fVar198;
    fVar267 = fVar212 * fVar212 * fVar212;
    fVar269 = fVar213 * fVar213 * fVar213;
    fVar288 = fVar214 * fVar214 * fVar214;
    fVar292 = fVar215 * fVar215 * fVar215;
    fVar296 = fVar216 * fVar216 * fVar216;
    fVar300 = fVar217 * fVar217 * fVar217;
    fVar305 = auVar208._0_4_ * auVar208._0_4_ * auVar208._0_4_;
    fVar315 = auVar208._4_4_ * auVar208._4_4_ * auVar208._4_4_;
    fVar316 = auVar208._8_4_ * auVar208._8_4_ * auVar208._8_4_;
    fVar317 = auVar208._12_4_ * auVar208._12_4_ * auVar208._12_4_;
    fVar318 = auVar208._16_4_ * auVar208._16_4_ * auVar208._16_4_;
    fVar319 = auVar208._20_4_ * auVar208._20_4_ * auVar208._20_4_;
    fVar320 = auVar208._24_4_ * auVar208._24_4_ * auVar208._24_4_;
    fVar233 = auVar208._0_4_ * fVar198;
    fVar237 = auVar208._4_4_ * fVar212;
    fVar239 = auVar208._8_4_ * fVar213;
    fVar241 = auVar208._12_4_ * fVar214;
    fVar243 = auVar208._16_4_ * fVar215;
    fVar245 = auVar208._20_4_ * fVar216;
    fVar266 = auVar208._24_4_ * fVar217;
    fVar265 = auVar357._28_4_ + auVar377._28_4_;
    fVar343 = auVar314._28_4_ + auVar264._28_4_ + fVar265;
    fVar352 = fVar265 + auVar284._28_4_ + auVar364._28_4_ + auVar350._28_4_;
    fVar265 = fVar235 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar270 = fVar269 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar293 = fVar292 * 0.16666667;
    fVar297 = fVar296 * 0.16666667;
    fVar301 = fVar300 * 0.16666667;
    fVar321 = (fVar305 + fVar235 * 4.0 + fVar198 * fVar233 * 12.0 + auVar208._0_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar331 = (fVar315 + fVar267 * 4.0 + fVar212 * fVar237 * 12.0 + auVar208._4_4_ * fVar237 * 6.0)
              * 0.16666667;
    fVar333 = (fVar316 + fVar269 * 4.0 + fVar213 * fVar239 * 12.0 + auVar208._8_4_ * fVar239 * 6.0)
              * 0.16666667;
    fVar335 = (fVar317 + fVar288 * 4.0 + fVar214 * fVar241 * 12.0 + auVar208._12_4_ * fVar241 * 6.0)
              * 0.16666667;
    fVar337 = (fVar318 + fVar292 * 4.0 + fVar215 * fVar243 * 12.0 + auVar208._16_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar339 = (fVar319 + fVar296 * 4.0 + fVar216 * fVar245 * 12.0 + auVar208._20_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar341 = (fVar320 + fVar300 * 4.0 + fVar217 * fVar266 * 12.0 + auVar208._24_4_ * fVar266 * 6.0)
              * 0.16666667;
    fVar235 = (fVar305 * 4.0 + fVar235 + auVar208._0_4_ * fVar233 * 12.0 + fVar198 * fVar233 * 6.0)
              * 0.16666667;
    fVar267 = (fVar315 * 4.0 + fVar267 + auVar208._4_4_ * fVar237 * 12.0 + fVar212 * fVar237 * 6.0)
              * 0.16666667;
    fVar269 = (fVar316 * 4.0 + fVar269 + auVar208._8_4_ * fVar239 * 12.0 + fVar213 * fVar239 * 6.0)
              * 0.16666667;
    fVar288 = (fVar317 * 4.0 + fVar288 + auVar208._12_4_ * fVar241 * 12.0 + fVar214 * fVar241 * 6.0)
              * 0.16666667;
    fVar292 = (fVar318 * 4.0 + fVar292 + auVar208._16_4_ * fVar243 * 12.0 + fVar215 * fVar243 * 6.0)
              * 0.16666667;
    fVar296 = (fVar319 * 4.0 + fVar296 + auVar208._20_4_ * fVar245 * 12.0 + fVar216 * fVar245 * 6.0)
              * 0.16666667;
    fVar300 = (fVar320 * 4.0 + fVar300 + auVar208._24_4_ * fVar266 * 12.0 + fVar217 * fVar266 * 6.0)
              * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar316 = fVar316 * 0.16666667;
    fVar317 = fVar317 * 0.16666667;
    fVar318 = fVar318 * 0.16666667;
    fVar319 = fVar319 * 0.16666667;
    fVar320 = fVar320 * 0.16666667;
    fVar371 = auVar364._28_4_ + 12.0;
    fVar353 = fVar352 + 12.166667;
    local_a80 = (float)local_1a0._0_4_ * fVar265 +
                (float)local_200._0_4_ * fVar321 +
                fVar305 * (float)local_380._0_4_ + fVar235 * (float)local_300._0_4_;
    fStack_a7c = (float)local_1a0._4_4_ * fVar268 +
                 (float)local_200._4_4_ * fVar331 +
                 fVar315 * (float)local_380._4_4_ + fVar267 * (float)local_300._4_4_;
    fStack_a78 = fStack_198 * fVar270 +
                 fStack_1f8 * fVar333 + fVar316 * fStack_378 + fVar269 * fStack_2f8;
    fStack_a74 = fStack_194 * fVar289 +
                 fStack_1f4 * fVar335 + fVar317 * fStack_374 + fVar288 * fStack_2f4;
    fStack_a70 = fStack_190 * fVar293 +
                 fStack_1f0 * fVar337 + fVar318 * fStack_370 + fVar292 * fStack_2f0;
    fStack_a6c = fStack_18c * fVar297 +
                 fStack_1ec * fVar339 + fVar319 * fStack_36c + fVar296 * fStack_2ec;
    fStack_a68 = fStack_188 * fVar301 +
                 fStack_1e8 * fVar341 + fVar320 * fStack_368 + fVar300 * fStack_2e8;
    fStack_a64 = fVar343 + fVar353;
    local_ac0 = (float)local_1c0._0_4_ * fVar265 +
                (float)local_220._0_4_ * fVar321 +
                fVar305 * (float)local_3a0._0_4_ + fVar235 * (float)local_320._0_4_;
    fStack_abc = (float)local_1c0._4_4_ * fVar268 +
                 (float)local_220._4_4_ * fVar331 +
                 fVar315 * (float)local_3a0._4_4_ + fVar267 * (float)local_320._4_4_;
    fStack_ab8 = fStack_1b8 * fVar270 +
                 fStack_218 * fVar333 + fVar316 * fStack_398 + fVar269 * fStack_318;
    fStack_ab4 = fStack_1b4 * fVar289 +
                 fStack_214 * fVar335 + fVar317 * fStack_394 + fVar288 * fStack_314;
    fStack_ab0 = fStack_1b0 * fVar293 +
                 fStack_210 * fVar337 + fVar318 * fStack_390 + fVar292 * fStack_310;
    fStack_aac = fStack_1ac * fVar297 +
                 fStack_20c * fVar339 + fVar319 * fStack_38c + fVar296 * fStack_30c;
    fStack_aa8 = fStack_1a8 * fVar301 +
                 fStack_208 * fVar341 + fVar320 * fStack_388 + fVar300 * fStack_308;
    fStack_aa4 = fStack_a64 + fVar371 + 12.166667;
    local_aa0 = (float)local_1e0._0_4_ * fVar265 +
                fVar321 * (float)local_240._0_4_ +
                fVar305 * (float)local_3c0._0_4_ + fVar235 * (float)local_340._0_4_;
    fStack_a9c = (float)local_1e0._4_4_ * fVar268 +
                 fVar331 * (float)local_240._4_4_ +
                 fVar315 * (float)local_3c0._4_4_ + fVar267 * (float)local_340._4_4_;
    fStack_a98 = fStack_1d8 * fVar270 +
                 fVar333 * fStack_238 + fVar316 * fStack_3b8 + fVar269 * fStack_338;
    fStack_a94 = fStack_1d4 * fVar289 +
                 fVar335 * fStack_234 + fVar317 * fStack_3b4 + fVar288 * fStack_334;
    fStack_a90 = fStack_1d0 * fVar293 +
                 fVar337 * fStack_230 + fVar318 * fStack_3b0 + fVar292 * fStack_330;
    fStack_a8c = fStack_1cc * fVar297 +
                 fVar339 * fStack_22c + fVar319 * fStack_3ac + fVar296 * fStack_32c;
    fStack_a88 = fStack_1c8 * fVar301 +
                 fVar341 * fStack_228 + fVar320 * fStack_3a8 + fVar300 * fStack_328;
    fStack_a84 = fStack_aa4 + fVar371 + auVar377._28_4_ + 12.0;
    local_700._0_4_ =
         fVar265 * (float)local_2c0._0_4_ +
         fVar321 * (float)local_2e0._0_4_ +
         fVar235 * (float)local_360._0_4_ + fVar305 * (float)local_3e0._0_4_;
    local_700._4_4_ =
         fVar268 * (float)local_2c0._4_4_ +
         fVar331 * (float)local_2e0._4_4_ +
         fVar267 * (float)local_360._4_4_ + fVar315 * (float)local_3e0._4_4_;
    local_700._8_4_ =
         fVar270 * fStack_2b8 + fVar333 * fStack_2d8 + fVar269 * fStack_358 + fVar316 * fStack_3d8;
    local_700._12_4_ =
         fVar289 * fStack_2b4 + fVar335 * fStack_2d4 + fVar288 * fStack_354 + fVar317 * fStack_3d4;
    local_700._16_4_ =
         fVar293 * fStack_2b0 + fVar337 * fStack_2d0 + fVar292 * fStack_350 + fVar318 * fStack_3d0;
    local_700._20_4_ =
         fVar297 * fStack_2ac + fVar339 * fStack_2cc + fVar296 * fStack_34c + fVar319 * fStack_3cc;
    local_700._24_4_ =
         fVar301 * fStack_2a8 + fVar341 * fStack_2c8 + fVar300 * fStack_348 + fVar320 * fStack_3c8;
    local_700._28_4_ = auVar284._28_4_ + fVar343 + fVar352 + auVar314._28_4_;
    auVar31._4_4_ = auVar208._4_4_ * -auVar208._4_4_;
    auVar31._0_4_ = auVar208._0_4_ * -auVar208._0_4_;
    auVar31._8_4_ = auVar208._8_4_ * -auVar208._8_4_;
    auVar31._12_4_ = auVar208._12_4_ * -auVar208._12_4_;
    auVar31._16_4_ = auVar208._16_4_ * -auVar208._16_4_;
    auVar31._20_4_ = auVar208._20_4_ * -auVar208._20_4_;
    auVar31._24_4_ = auVar208._24_4_ * -auVar208._24_4_;
    auVar31._28_4_ = auVar208._28_4_;
    auVar32._4_4_ = fVar237 * 4.0;
    auVar32._0_4_ = fVar233 * 4.0;
    auVar32._8_4_ = fVar239 * 4.0;
    auVar32._12_4_ = fVar241 * 4.0;
    auVar32._16_4_ = fVar243 * 4.0;
    auVar32._20_4_ = fVar245 * 4.0;
    auVar32._24_4_ = fVar266 * 4.0;
    auVar32._28_4_ = auVar264._28_4_;
    auVar123 = vsubps_avx(auVar31,auVar32);
    fVar289 = fVar198 * -fVar198 * 0.5;
    fVar293 = fVar212 * -fVar212 * 0.5;
    fVar301 = fVar213 * -fVar213 * 0.5;
    fVar305 = fVar214 * -fVar214 * 0.5;
    fVar315 = fVar215 * -fVar215 * 0.5;
    fVar316 = fVar216 * -fVar216 * 0.5;
    fVar317 = fVar217 * -fVar217 * 0.5;
    fVar265 = auVar123._0_4_ * 0.5;
    fVar269 = auVar123._4_4_ * 0.5;
    fVar270 = auVar123._8_4_ * 0.5;
    fVar288 = auVar123._12_4_ * 0.5;
    fVar296 = auVar123._16_4_ * 0.5;
    fVar297 = auVar123._20_4_ * 0.5;
    fVar300 = auVar123._24_4_ * 0.5;
    fVar235 = (fVar198 * fVar198 + fVar233 * 4.0) * 0.5;
    fVar237 = (fVar212 * fVar212 + fVar237 * 4.0) * 0.5;
    fVar239 = (fVar213 * fVar213 + fVar239 * 4.0) * 0.5;
    fVar241 = (fVar214 * fVar214 + fVar241 * 4.0) * 0.5;
    fVar243 = (fVar215 * fVar215 + fVar243 * 4.0) * 0.5;
    fVar267 = (fVar216 * fVar216 + fVar245 * 4.0) * 0.5;
    fVar268 = (fVar217 * fVar217 + fVar266 * 4.0) * 0.5;
    fVar198 = auVar208._0_4_ * auVar208._0_4_ * 0.5;
    fVar212 = auVar208._4_4_ * auVar208._4_4_ * 0.5;
    fVar213 = auVar208._8_4_ * auVar208._8_4_ * 0.5;
    fVar214 = auVar208._12_4_ * auVar208._12_4_ * 0.5;
    fVar215 = auVar208._16_4_ * auVar208._16_4_ * 0.5;
    fVar216 = auVar208._20_4_ * auVar208._20_4_ * 0.5;
    fVar233 = auVar208._24_4_ * auVar208._24_4_ * 0.5;
    fVar304 = fStack_a84 + fVar353 + fVar353 + 4.0;
    auVar146 = vpermilps_avx(ZEXT416((uint)(fVar218 * 0.04761905)),0);
    fVar217 = auVar146._0_4_;
    fVar272 = fVar217 * ((float)local_1a0._0_4_ * fVar289 +
                        (float)local_200._0_4_ * fVar265 +
                        fVar235 * (float)local_300._0_4_ + fVar198 * (float)local_380._0_4_);
    fVar245 = auVar146._4_4_;
    fVar285 = fVar245 * ((float)local_1a0._4_4_ * fVar293 +
                        (float)local_200._4_4_ * fVar269 +
                        fVar237 * (float)local_300._4_4_ + fVar212 * (float)local_380._4_4_);
    local_a00._4_4_ = fVar285;
    local_a00._0_4_ = fVar272;
    fVar266 = auVar146._8_4_;
    fVar286 = fVar266 * (fStack_198 * fVar301 +
                        fStack_1f8 * fVar270 + fVar239 * fStack_2f8 + fVar213 * fStack_378);
    local_a00._8_4_ = fVar286;
    fVar292 = auVar146._12_4_;
    fVar290 = fVar292 * (fStack_194 * fVar305 +
                        fStack_1f4 * fVar288 + fVar241 * fStack_2f4 + fVar214 * fStack_374);
    local_a00._12_4_ = fVar290;
    fVar294 = fVar217 * (fStack_190 * fVar315 +
                        fStack_1f0 * fVar296 + fVar243 * fStack_2f0 + fVar215 * fStack_370);
    local_a00._16_4_ = fVar294;
    fVar298 = fVar245 * (fStack_18c * fVar316 +
                        fStack_1ec * fVar297 + fVar267 * fStack_2ec + fVar216 * fStack_36c);
    local_a00._20_4_ = fVar298;
    fVar302 = fVar266 * (fStack_188 * fVar317 +
                        fStack_1e8 * fVar300 + fVar268 * fStack_2e8 + fVar233 * fStack_368);
    local_a00._24_4_ = fVar302;
    local_a00._28_4_ = fVar304;
    fVar372 = fVar217 * ((float)local_1c0._0_4_ * fVar289 +
                        (float)local_220._0_4_ * fVar265 +
                        fVar235 * (float)local_320._0_4_ + fVar198 * (float)local_3a0._0_4_);
    fVar378 = fVar245 * ((float)local_1c0._4_4_ * fVar293 +
                        (float)local_220._4_4_ * fVar269 +
                        fVar237 * (float)local_320._4_4_ + fVar212 * (float)local_3a0._4_4_);
    local_840._4_4_ = fVar378;
    local_840._0_4_ = fVar372;
    fVar380 = fVar266 * (fStack_1b8 * fVar301 +
                        fStack_218 * fVar270 + fVar239 * fStack_318 + fVar213 * fStack_398);
    local_840._8_4_ = fVar380;
    fVar381 = fVar292 * (fStack_1b4 * fVar305 +
                        fStack_214 * fVar288 + fVar241 * fStack_314 + fVar214 * fStack_394);
    local_840._12_4_ = fVar381;
    fVar382 = fVar217 * (fStack_1b0 * fVar315 +
                        fStack_210 * fVar296 + fVar243 * fStack_310 + fVar215 * fStack_390);
    local_840._16_4_ = fVar382;
    fVar383 = fVar245 * (fStack_1ac * fVar316 +
                        fStack_20c * fVar297 + fVar267 * fStack_30c + fVar216 * fStack_38c);
    local_840._20_4_ = fVar383;
    fVar384 = fVar266 * (fStack_1a8 * fVar317 +
                        fStack_208 * fVar300 + fVar268 * fStack_308 + fVar233 * fStack_388);
    local_840._24_4_ = fVar384;
    local_840._28_4_ = fStack_184;
    fVar386 = fVar217 * ((float)local_1e0._0_4_ * fVar289 +
                        fVar198 * (float)local_3c0._0_4_ + fVar235 * (float)local_340._0_4_ +
                        (float)local_240._0_4_ * fVar265);
    fVar391 = fVar245 * ((float)local_1e0._4_4_ * fVar293 +
                        fVar212 * (float)local_3c0._4_4_ + fVar237 * (float)local_340._4_4_ +
                        (float)local_240._4_4_ * fVar269);
    local_9c0._4_4_ = fVar391;
    local_9c0._0_4_ = fVar386;
    fVar393 = fVar266 * (fStack_1d8 * fVar301 +
                        fVar213 * fStack_3b8 + fVar239 * fStack_338 + fStack_238 * fVar270);
    local_9c0._8_4_ = fVar393;
    fVar395 = fVar292 * (fStack_1d4 * fVar305 +
                        fVar214 * fStack_3b4 + fVar241 * fStack_334 + fStack_234 * fVar288);
    local_9c0._12_4_ = fVar395;
    fVar397 = fVar217 * (fStack_1d0 * fVar315 +
                        fVar215 * fStack_3b0 + fVar243 * fStack_330 + fStack_230 * fVar296);
    local_9c0._16_4_ = fVar397;
    fVar399 = fVar245 * (fStack_1cc * fVar316 +
                        fVar216 * fStack_3ac + fVar267 * fStack_32c + fStack_22c * fVar297);
    local_9c0._20_4_ = fVar399;
    fVar401 = fVar266 * (fStack_1c8 * fVar317 +
                        fVar233 * fStack_3a8 + fVar268 * fStack_328 + fStack_228 * fVar300);
    local_9c0._24_4_ = fVar401;
    local_9c0._28_4_ = uStack_1a4;
    fVar218 = fVar217 * (fVar289 * (float)local_2c0._0_4_ +
                        fVar265 * (float)local_2e0._0_4_ +
                        fVar198 * (float)local_3e0._0_4_ + fVar235 * (float)local_360._0_4_);
    fVar265 = fVar245 * (fVar293 * (float)local_2c0._4_4_ +
                        fVar269 * (float)local_2e0._4_4_ +
                        fVar212 * (float)local_3e0._4_4_ + fVar237 * (float)local_360._4_4_);
    auVar33._4_4_ = fVar265;
    auVar33._0_4_ = fVar218;
    fVar289 = fVar266 * (fVar301 * fStack_2b8 +
                        fVar270 * fStack_2d8 + fVar213 * fStack_3d8 + fVar239 * fStack_358);
    auVar33._8_4_ = fVar289;
    fVar293 = fVar292 * (fVar305 * fStack_2b4 +
                        fVar288 * fStack_2d4 + fVar214 * fStack_3d4 + fVar241 * fStack_354);
    auVar33._12_4_ = fVar293;
    fVar217 = fVar217 * (fVar315 * fStack_2b0 +
                        fVar296 * fStack_2d0 + fVar215 * fStack_3d0 + fVar243 * fStack_350);
    auVar33._16_4_ = fVar217;
    fVar245 = fVar245 * (fVar316 * fStack_2ac +
                        fVar297 * fStack_2cc + fVar216 * fStack_3cc + fVar267 * fStack_34c);
    auVar33._20_4_ = fVar245;
    fVar266 = fVar266 * (fVar317 * fStack_2a8 +
                        fVar300 * fStack_2c8 + fVar233 * fStack_3c8 + fVar268 * fStack_348);
    auVar33._24_4_ = fVar266;
    auVar33._28_4_ = fVar292;
    auVar90._4_4_ = fStack_abc;
    auVar90._0_4_ = local_ac0;
    auVar90._8_4_ = fStack_ab8;
    auVar90._12_4_ = fStack_ab4;
    auVar90._16_4_ = fStack_ab0;
    auVar90._20_4_ = fStack_aac;
    auVar90._24_4_ = fStack_aa8;
    auVar90._28_4_ = fStack_aa4;
    auVar123 = vperm2f128_avx(auVar90,auVar90,1);
    auVar123 = vshufps_avx(auVar123,auVar90,0x30);
    _local_880 = vshufps_avx(auVar90,auVar123,0x29);
    auVar92._4_4_ = fStack_a9c;
    auVar92._0_4_ = local_aa0;
    auVar92._8_4_ = fStack_a98;
    auVar92._12_4_ = fStack_a94;
    auVar92._16_4_ = fStack_a90;
    auVar92._20_4_ = fStack_a8c;
    auVar92._24_4_ = fStack_a88;
    auVar92._28_4_ = fStack_a84;
    auVar123 = vperm2f128_avx(auVar92,auVar92,1);
    auVar123 = vshufps_avx(auVar123,auVar92,0x30);
    local_8a0 = vshufps_avx(auVar92,auVar123,0x29);
    auVar159 = vsubps_avx(local_700,auVar33);
    auVar123 = vperm2f128_avx(auVar159,auVar159,1);
    auVar123 = vshufps_avx(auVar123,auVar159,0x30);
    local_720 = vshufps_avx(auVar159,auVar123,0x29);
    _local_680 = vsubps_avx(_local_880,auVar90);
    _local_660 = vsubps_avx(local_8a0,auVar92);
    fVar212 = local_680._0_4_;
    fVar235 = local_680._4_4_;
    auVar34._4_4_ = fVar391 * fVar235;
    auVar34._0_4_ = fVar386 * fVar212;
    fVar267 = local_680._8_4_;
    auVar34._8_4_ = fVar393 * fVar267;
    fVar296 = local_680._12_4_;
    auVar34._12_4_ = fVar395 * fVar296;
    fVar318 = local_680._16_4_;
    auVar34._16_4_ = fVar397 * fVar318;
    fVar339 = local_680._20_4_;
    auVar34._20_4_ = fVar399 * fVar339;
    fVar22 = local_680._24_4_;
    auVar34._24_4_ = fVar401 * fVar22;
    auVar34._28_4_ = auVar159._28_4_;
    fVar213 = local_660._0_4_;
    fVar237 = local_660._4_4_;
    auVar35._4_4_ = fVar378 * fVar237;
    auVar35._0_4_ = fVar372 * fVar213;
    fVar268 = local_660._8_4_;
    auVar35._8_4_ = fVar380 * fVar268;
    fVar297 = local_660._12_4_;
    auVar35._12_4_ = fVar381 * fVar297;
    fVar319 = local_660._16_4_;
    auVar35._16_4_ = fVar382 * fVar319;
    fVar341 = local_660._20_4_;
    auVar35._20_4_ = fVar383 * fVar341;
    fVar23 = local_660._24_4_;
    auVar35._24_4_ = fVar384 * fVar23;
    auVar35._28_4_ = auVar123._28_4_;
    auVar17 = vsubps_avx(auVar35,auVar34);
    auVar94._4_4_ = fStack_a7c;
    auVar94._0_4_ = local_a80;
    auVar94._8_4_ = fStack_a78;
    auVar94._12_4_ = fStack_a74;
    auVar94._16_4_ = fStack_a70;
    auVar94._20_4_ = fStack_a6c;
    auVar94._24_4_ = fStack_a68;
    auVar94._28_4_ = fStack_a64;
    auVar123 = vperm2f128_avx(auVar94,auVar94,1);
    auVar123 = vshufps_avx(auVar123,auVar94,0x30);
    local_940 = vshufps_avx(auVar94,auVar123,0x29);
    _local_6a0 = vsubps_avx(local_940,auVar94);
    auVar36._4_4_ = fVar237 * fVar285;
    auVar36._0_4_ = fVar213 * fVar272;
    auVar36._8_4_ = fVar268 * fVar286;
    auVar36._12_4_ = fVar297 * fVar290;
    auVar36._16_4_ = fVar319 * fVar294;
    auVar36._20_4_ = fVar341 * fVar298;
    auVar36._24_4_ = fVar23 * fVar302;
    auVar36._28_4_ = auVar123._28_4_;
    fVar214 = local_6a0._0_4_;
    fVar239 = local_6a0._4_4_;
    auVar37._4_4_ = fVar391 * fVar239;
    auVar37._0_4_ = fVar386 * fVar214;
    fVar269 = local_6a0._8_4_;
    auVar37._8_4_ = fVar393 * fVar269;
    fVar300 = local_6a0._12_4_;
    auVar37._12_4_ = fVar395 * fVar300;
    fVar320 = local_6a0._16_4_;
    auVar37._16_4_ = fVar397 * fVar320;
    fVar343 = local_6a0._20_4_;
    auVar37._20_4_ = fVar399 * fVar343;
    fVar24 = local_6a0._24_4_;
    auVar37._24_4_ = fVar401 * fVar24;
    auVar37._28_4_ = local_8a0._28_4_;
    auVar18 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar378 * fVar239;
    auVar38._0_4_ = fVar372 * fVar214;
    auVar38._8_4_ = fVar380 * fVar269;
    auVar38._12_4_ = fVar381 * fVar300;
    auVar38._16_4_ = fVar382 * fVar320;
    auVar38._20_4_ = fVar383 * fVar343;
    auVar38._24_4_ = fVar384 * fVar24;
    auVar38._28_4_ = local_8a0._28_4_;
    auVar39._4_4_ = fVar235 * fVar285;
    auVar39._0_4_ = fVar212 * fVar272;
    auVar39._8_4_ = fVar267 * fVar286;
    auVar39._12_4_ = fVar296 * fVar290;
    auVar39._16_4_ = fVar318 * fVar294;
    auVar39._20_4_ = fVar339 * fVar298;
    auVar39._24_4_ = fVar22 * fVar302;
    auVar39._28_4_ = uStack_1c4;
    auVar160 = vsubps_avx(auVar39,auVar38);
    fVar198 = auVar160._28_4_;
    auVar158._0_4_ = fVar214 * fVar214 + fVar212 * fVar212 + fVar213 * fVar213;
    auVar158._4_4_ = fVar239 * fVar239 + fVar235 * fVar235 + fVar237 * fVar237;
    auVar158._8_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar268 * fVar268;
    auVar158._12_4_ = fVar300 * fVar300 + fVar296 * fVar296 + fVar297 * fVar297;
    auVar158._16_4_ = fVar320 * fVar320 + fVar318 * fVar318 + fVar319 * fVar319;
    auVar158._20_4_ = fVar343 * fVar343 + fVar339 * fVar339 + fVar341 * fVar341;
    auVar158._24_4_ = fVar24 * fVar24 + fVar22 * fVar22 + fVar23 * fVar23;
    auVar158._28_4_ = fVar198 + fVar198 + auVar17._28_4_;
    auVar123 = vrcpps_avx(auVar158);
    fVar315 = auVar123._0_4_;
    fVar316 = auVar123._4_4_;
    auVar40._4_4_ = fVar316 * auVar158._4_4_;
    auVar40._0_4_ = fVar315 * auVar158._0_4_;
    fVar317 = auVar123._8_4_;
    auVar40._8_4_ = fVar317 * auVar158._8_4_;
    fVar333 = auVar123._12_4_;
    auVar40._12_4_ = fVar333 * auVar158._12_4_;
    fVar335 = auVar123._16_4_;
    auVar40._16_4_ = fVar335 * auVar158._16_4_;
    fVar337 = auVar123._20_4_;
    auVar40._20_4_ = fVar337 * auVar158._20_4_;
    fVar371 = auVar123._24_4_;
    auVar40._24_4_ = fVar371 * auVar158._24_4_;
    auVar40._28_4_ = uStack_1c4;
    auVar192._8_4_ = 0x3f800000;
    auVar192._0_8_ = &DAT_3f8000003f800000;
    auVar192._12_4_ = 0x3f800000;
    auVar192._16_4_ = 0x3f800000;
    auVar192._20_4_ = 0x3f800000;
    auVar192._24_4_ = 0x3f800000;
    auVar192._28_4_ = 0x3f800000;
    auVar162 = vsubps_avx(auVar192,auVar40);
    fVar315 = auVar162._0_4_ * fVar315 + fVar315;
    fVar316 = auVar162._4_4_ * fVar316 + fVar316;
    fVar317 = auVar162._8_4_ * fVar317 + fVar317;
    fVar333 = auVar162._12_4_ * fVar333 + fVar333;
    fVar335 = auVar162._16_4_ * fVar335 + fVar335;
    fVar337 = auVar162._20_4_ * fVar337 + fVar337;
    fVar371 = auVar162._24_4_ * fVar371 + fVar371;
    auVar159 = vperm2f128_avx(local_840,local_840,1);
    auVar159 = vshufps_avx(auVar159,local_840,0x30);
    local_9e0 = vshufps_avx(local_840,auVar159,0x29);
    auVar159 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar159 = vshufps_avx(auVar159,local_9c0,0x30);
    local_7e0 = vshufps_avx(local_9c0,auVar159,0x29);
    fVar387 = local_7e0._0_4_;
    fVar392 = local_7e0._4_4_;
    auVar41._4_4_ = fVar392 * fVar235;
    auVar41._0_4_ = fVar387 * fVar212;
    fVar394 = local_7e0._8_4_;
    auVar41._8_4_ = fVar394 * fVar267;
    fVar396 = local_7e0._12_4_;
    auVar41._12_4_ = fVar396 * fVar296;
    fVar398 = local_7e0._16_4_;
    auVar41._16_4_ = fVar398 * fVar318;
    fVar400 = local_7e0._20_4_;
    auVar41._20_4_ = fVar400 * fVar339;
    fVar402 = local_7e0._24_4_;
    auVar41._24_4_ = fVar402 * fVar22;
    auVar41._28_4_ = auVar159._28_4_;
    fVar215 = local_9e0._0_4_;
    fVar241 = local_9e0._4_4_;
    auVar42._4_4_ = fVar237 * fVar241;
    auVar42._0_4_ = fVar213 * fVar215;
    fVar270 = local_9e0._8_4_;
    auVar42._8_4_ = fVar268 * fVar270;
    fVar301 = local_9e0._12_4_;
    auVar42._12_4_ = fVar297 * fVar301;
    fVar321 = local_9e0._16_4_;
    auVar42._16_4_ = fVar319 * fVar321;
    fVar352 = local_9e0._20_4_;
    auVar42._20_4_ = fVar341 * fVar352;
    fVar25 = local_9e0._24_4_;
    auVar42._24_4_ = fVar23 * fVar25;
    auVar42._28_4_ = fStack_184;
    auVar327 = vsubps_avx(auVar42,auVar41);
    auVar159 = vperm2f128_avx(local_a00,local_a00,1);
    auVar159 = vshufps_avx(auVar159,local_a00,0x30);
    local_960 = vshufps_avx(local_a00,auVar159,0x29);
    fVar216 = local_960._0_4_;
    fVar243 = local_960._4_4_;
    auVar43._4_4_ = fVar237 * fVar243;
    auVar43._0_4_ = fVar213 * fVar216;
    fVar288 = local_960._8_4_;
    auVar43._8_4_ = fVar268 * fVar288;
    fVar305 = local_960._12_4_;
    auVar43._12_4_ = fVar297 * fVar305;
    fVar331 = local_960._16_4_;
    auVar43._16_4_ = fVar319 * fVar331;
    fVar353 = local_960._20_4_;
    auVar43._20_4_ = fVar341 * fVar353;
    fVar26 = local_960._24_4_;
    auVar43._24_4_ = fVar23 * fVar26;
    auVar43._28_4_ = auVar159._28_4_;
    auVar44._4_4_ = fVar392 * fVar239;
    auVar44._0_4_ = fVar387 * fVar214;
    auVar44._8_4_ = fVar394 * fVar269;
    auVar44._12_4_ = fVar396 * fVar300;
    auVar44._16_4_ = fVar398 * fVar320;
    auVar44._20_4_ = fVar400 * fVar343;
    uVar15 = local_7e0._28_4_;
    auVar44._24_4_ = fVar402 * fVar24;
    auVar44._28_4_ = uVar15;
    auVar159 = vsubps_avx(auVar44,auVar43);
    auVar20 = local_9e0;
    auVar45._4_4_ = fVar239 * fVar241;
    auVar45._0_4_ = fVar214 * fVar215;
    auVar45._8_4_ = fVar269 * fVar270;
    auVar45._12_4_ = fVar300 * fVar301;
    auVar45._16_4_ = fVar320 * fVar321;
    auVar45._20_4_ = fVar343 * fVar352;
    auVar45._24_4_ = fVar24 * fVar25;
    auVar45._28_4_ = uVar15;
    auVar46._4_4_ = fVar235 * fVar243;
    auVar46._0_4_ = fVar212 * fVar216;
    auVar46._8_4_ = fVar267 * fVar288;
    auVar46._12_4_ = fVar296 * fVar305;
    auVar46._16_4_ = fVar318 * fVar331;
    auVar46._20_4_ = fVar339 * fVar353;
    auVar46._24_4_ = fVar22 * fVar26;
    auVar46._28_4_ = uStack_1e4;
    auVar19 = vsubps_avx(auVar46,auVar45);
    fVar233 = auVar19._28_4_;
    fVar385 = auVar159._28_4_ + fVar233;
    auVar47._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar160._4_4_ * auVar160._4_4_) * fVar316;
    auVar47._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar160._0_4_ * auVar160._0_4_) * fVar315;
    auVar47._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar160._8_4_ * auVar160._8_4_) * fVar317;
    auVar47._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar160._12_4_ * auVar160._12_4_) * fVar333;
    auVar47._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar160._16_4_ * auVar160._16_4_) * fVar335;
    auVar47._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar160._20_4_ * auVar160._20_4_) * fVar337;
    auVar47._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar160._24_4_ * auVar160._24_4_) * fVar371;
    auVar47._28_4_ = auVar17._28_4_ + auVar18._28_4_ + fVar198;
    auVar48._4_4_ =
         (auVar327._4_4_ * auVar327._4_4_ +
         auVar159._4_4_ * auVar159._4_4_ + auVar19._4_4_ * auVar19._4_4_) * fVar316;
    auVar48._0_4_ =
         (auVar327._0_4_ * auVar327._0_4_ +
         auVar159._0_4_ * auVar159._0_4_ + auVar19._0_4_ * auVar19._0_4_) * fVar315;
    auVar48._8_4_ =
         (auVar327._8_4_ * auVar327._8_4_ +
         auVar159._8_4_ * auVar159._8_4_ + auVar19._8_4_ * auVar19._8_4_) * fVar317;
    auVar48._12_4_ =
         (auVar327._12_4_ * auVar327._12_4_ +
         auVar159._12_4_ * auVar159._12_4_ + auVar19._12_4_ * auVar19._12_4_) * fVar333;
    auVar48._16_4_ =
         (auVar327._16_4_ * auVar327._16_4_ +
         auVar159._16_4_ * auVar159._16_4_ + auVar19._16_4_ * auVar19._16_4_) * fVar335;
    auVar48._20_4_ =
         (auVar327._20_4_ * auVar327._20_4_ +
         auVar159._20_4_ * auVar159._20_4_ + auVar19._20_4_ * auVar19._20_4_) * fVar337;
    auVar48._24_4_ =
         (auVar327._24_4_ * auVar327._24_4_ +
         auVar159._24_4_ * auVar159._24_4_ + auVar19._24_4_ * auVar19._24_4_) * fVar371;
    auVar48._28_4_ = auVar162._28_4_ + auVar123._28_4_;
    auVar123 = vmaxps_avx(auVar47,auVar48);
    auVar159 = vperm2f128_avx(local_700,local_700,1);
    auVar159 = vshufps_avx(auVar159,local_700,0x30);
    local_740 = vshufps_avx(local_700,auVar159,0x29);
    local_760._0_4_ = (float)local_700._0_4_ + fVar218;
    local_760._4_4_ = local_700._4_4_ + fVar265;
    fStack_758 = local_700._8_4_ + fVar289;
    fStack_754 = local_700._12_4_ + fVar293;
    fStack_750 = local_700._16_4_ + fVar217;
    fStack_74c = local_700._20_4_ + fVar245;
    fStack_748 = local_700._24_4_ + fVar266;
    fStack_744 = local_700._28_4_ + fVar292;
    auVar159 = vmaxps_avx(local_700,_local_760);
    auVar17 = vmaxps_avx(local_720,local_740);
    _local_a60 = vmaxps_avx(auVar159,auVar17);
    auVar159 = vrsqrtps_avx(auVar158);
    fVar198 = auVar159._0_4_;
    fVar217 = auVar159._4_4_;
    fVar218 = auVar159._8_4_;
    fVar245 = auVar159._12_4_;
    fVar265 = auVar159._16_4_;
    fVar266 = auVar159._20_4_;
    fVar289 = auVar159._24_4_;
    auVar49._4_4_ = fVar217 * fVar217 * fVar217 * auVar158._4_4_ * 0.5;
    auVar49._0_4_ = fVar198 * fVar198 * fVar198 * auVar158._0_4_ * 0.5;
    auVar49._8_4_ = fVar218 * fVar218 * fVar218 * auVar158._8_4_ * 0.5;
    auVar49._12_4_ = fVar245 * fVar245 * fVar245 * auVar158._12_4_ * 0.5;
    auVar49._16_4_ = fVar265 * fVar265 * fVar265 * auVar158._16_4_ * 0.5;
    auVar49._20_4_ = fVar266 * fVar266 * fVar266 * auVar158._20_4_ * 0.5;
    auVar49._24_4_ = fVar289 * fVar289 * fVar289 * auVar158._24_4_ * 0.5;
    auVar49._28_4_ = auVar158._28_4_;
    auVar50._4_4_ = fVar217 * 1.5;
    auVar50._0_4_ = fVar198 * 1.5;
    auVar50._8_4_ = fVar218 * 1.5;
    auVar50._12_4_ = fVar245 * 1.5;
    auVar50._16_4_ = fVar265 * 1.5;
    auVar50._20_4_ = fVar266 * 1.5;
    auVar50._24_4_ = fVar289 * 1.5;
    auVar50._28_4_ = auVar159._28_4_;
    local_5a0 = vsubps_avx(auVar50,auVar49);
    auVar91._4_4_ = fStack_abc;
    auVar91._0_4_ = local_ac0;
    auVar91._8_4_ = fStack_ab8;
    auVar91._12_4_ = fStack_ab4;
    auVar91._16_4_ = fStack_ab0;
    auVar91._20_4_ = fStack_aac;
    auVar91._24_4_ = fStack_aa8;
    auVar91._28_4_ = fStack_aa4;
    auVar159 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8c0 = vsubps_avx(auVar159,auVar91);
    auVar93._4_4_ = fStack_a9c;
    auVar93._0_4_ = local_aa0;
    auVar93._8_4_ = fStack_a98;
    auVar93._12_4_ = fStack_a94;
    auVar93._16_4_ = fStack_a90;
    auVar93._20_4_ = fStack_a8c;
    auVar93._24_4_ = fStack_a88;
    auVar93._28_4_ = fStack_a84;
    auVar159 = vsubps_avx(auVar159,auVar93);
    fVar217 = auVar159._0_4_;
    fVar245 = auVar159._4_4_;
    fVar289 = auVar159._8_4_;
    fVar315 = auVar159._12_4_;
    fVar333 = auVar159._16_4_;
    fVar371 = auVar159._20_4_;
    fVar27 = auVar159._24_4_;
    fVar218 = local_8c0._0_4_;
    fVar265 = local_8c0._4_4_;
    fVar292 = local_8c0._8_4_;
    fVar316 = local_8c0._12_4_;
    fVar335 = local_8c0._16_4_;
    fVar21 = local_8c0._20_4_;
    fVar28 = local_8c0._24_4_;
    auVar160 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar17 = vsubps_avx(auVar160,auVar94);
    auVar364 = ZEXT3264(auVar17);
    fVar358 = auVar17._0_4_;
    fVar365 = auVar17._4_4_;
    fVar366 = auVar17._8_4_;
    fVar367 = auVar17._12_4_;
    fVar368 = auVar17._16_4_;
    fVar369 = auVar17._20_4_;
    fVar370 = auVar17._24_4_;
    auVar356._0_4_ = fVar358 * local_520 + local_540 * fVar218 + local_620 * fVar217;
    auVar356._4_4_ = fVar365 * fStack_51c + fStack_53c * fVar265 + fStack_61c * fVar245;
    auVar356._8_4_ = fVar366 * fStack_518 + fStack_538 * fVar292 + fStack_618 * fVar289;
    auVar356._12_4_ = fVar367 * fStack_514 + fStack_534 * fVar316 + fStack_614 * fVar315;
    auVar356._16_4_ = fVar368 * fStack_510 + fStack_530 * fVar335 + fStack_610 * fVar333;
    auVar356._20_4_ = fVar369 * fStack_50c + fStack_52c * fVar21 + fStack_60c * fVar371;
    auVar356._24_4_ = fVar370 * fStack_508 + fStack_528 * fVar28 + fStack_608 * fVar27;
    auVar356._28_4_ = fVar385 + fVar385 + auVar327._28_4_ + fVar385;
    auVar375._0_4_ = fVar358 * fVar358 + fVar218 * fVar218 + fVar217 * fVar217;
    auVar375._4_4_ = fVar365 * fVar365 + fVar265 * fVar265 + fVar245 * fVar245;
    auVar375._8_4_ = fVar366 * fVar366 + fVar292 * fVar292 + fVar289 * fVar289;
    auVar375._12_4_ = fVar367 * fVar367 + fVar316 * fVar316 + fVar315 * fVar315;
    auVar375._16_4_ = fVar368 * fVar368 + fVar335 * fVar335 + fVar333 * fVar333;
    auVar375._20_4_ = fVar369 * fVar369 + fVar21 * fVar21 + fVar371 * fVar371;
    auVar375._24_4_ = fVar370 * fVar370 + fVar28 * fVar28 + fVar27 * fVar27;
    auVar375._28_4_ = fVar233 + fVar233 + fVar385;
    fVar233 = local_5a0._0_4_;
    fVar266 = local_5a0._4_4_;
    fVar293 = local_5a0._8_4_;
    fVar317 = local_5a0._12_4_;
    fVar337 = local_5a0._16_4_;
    fVar385 = local_5a0._20_4_;
    fVar271 = local_5a0._24_4_;
    fVar322 = local_520 * fVar214 * fVar233 +
              fVar212 * fVar233 * local_540 + fVar213 * fVar233 * local_620;
    fVar332 = fStack_51c * fVar239 * fVar266 +
              fVar235 * fVar266 * fStack_53c + fVar237 * fVar266 * fStack_61c;
    fVar334 = fStack_518 * fVar269 * fVar293 +
              fVar267 * fVar293 * fStack_538 + fVar268 * fVar293 * fStack_618;
    fVar336 = fStack_514 * fVar300 * fVar317 +
              fVar296 * fVar317 * fStack_534 + fVar297 * fVar317 * fStack_614;
    fVar338 = fStack_510 * fVar320 * fVar337 +
              fVar318 * fVar337 * fStack_530 + fVar319 * fVar337 * fStack_610;
    fVar340 = fStack_50c * fVar343 * fVar385 +
              fVar339 * fVar385 * fStack_52c + fVar341 * fVar385 * fStack_60c;
    fVar342 = fStack_508 * fVar24 * fVar271 +
              fVar22 * fVar271 * fStack_528 + fVar23 * fVar271 * fStack_608;
    fVar344 = fStack_504 + fStack_524 + fStack_604;
    fVar198 = fStack_504 + fStack_524 + fStack_604;
    local_6e0._0_4_ =
         fVar358 * fVar214 * fVar233 + fVar212 * fVar233 * fVar218 + fVar213 * fVar233 * fVar217;
    local_6e0._4_4_ =
         fVar365 * fVar239 * fVar266 + fVar235 * fVar266 * fVar265 + fVar237 * fVar266 * fVar245;
    local_6e0._8_4_ =
         fVar366 * fVar269 * fVar293 + fVar267 * fVar293 * fVar292 + fVar268 * fVar293 * fVar289;
    local_6e0._12_4_ =
         fVar367 * fVar300 * fVar317 + fVar296 * fVar317 * fVar316 + fVar297 * fVar317 * fVar315;
    local_6e0._16_4_ =
         fVar368 * fVar320 * fVar337 + fVar318 * fVar337 * fVar335 + fVar319 * fVar337 * fVar333;
    local_6e0._20_4_ =
         fVar369 * fVar343 * fVar385 + fVar339 * fVar385 * fVar21 + fVar341 * fVar385 * fVar371;
    local_6e0._24_4_ =
         fVar370 * fVar24 * fVar271 + fVar22 * fVar271 * fVar28 + fVar23 * fVar271 * fVar27;
    local_6e0._28_4_ = fStack_524 + fVar198;
    auVar51._4_4_ = fVar332 * local_6e0._4_4_;
    auVar51._0_4_ = fVar322 * local_6e0._0_4_;
    auVar51._8_4_ = fVar334 * local_6e0._8_4_;
    auVar51._12_4_ = fVar336 * local_6e0._12_4_;
    auVar51._16_4_ = fVar338 * local_6e0._16_4_;
    auVar51._20_4_ = fVar340 * local_6e0._20_4_;
    auVar51._24_4_ = fVar342 * local_6e0._24_4_;
    auVar51._28_4_ = fVar198;
    auVar17 = vsubps_avx(auVar356,auVar51);
    auVar52._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
    auVar52._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
    auVar52._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
    auVar52._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
    auVar52._16_4_ = local_6e0._16_4_ * local_6e0._16_4_;
    auVar52._20_4_ = local_6e0._20_4_ * local_6e0._20_4_;
    auVar52._24_4_ = local_6e0._24_4_ * local_6e0._24_4_;
    auVar52._28_4_ = local_6e0._28_4_;
    local_640 = vsubps_avx(auVar375,auVar52);
    _local_560 = vsqrtps_avx(auVar123);
    fVar198 = (local_560._0_4_ + (float)local_a60._0_4_) * 1.0000002;
    fVar131 = (local_560._4_4_ + (float)local_a60._4_4_) * 1.0000002;
    fVar133 = (local_560._8_4_ + fStack_a58) * 1.0000002;
    fVar135 = (local_560._12_4_ + fStack_a54) * 1.0000002;
    fVar136 = (local_560._16_4_ + fStack_a50) * 1.0000002;
    fVar137 = (local_560._20_4_ + fStack_a4c) * 1.0000002;
    fVar138 = (local_560._24_4_ + fStack_a48) * 1.0000002;
    auVar53._4_4_ = fVar131 * fVar131;
    auVar53._0_4_ = fVar198 * fVar198;
    auVar53._8_4_ = fVar133 * fVar133;
    auVar53._12_4_ = fVar135 * fVar135;
    auVar53._16_4_ = fVar136 * fVar136;
    auVar53._20_4_ = fVar137 * fVar137;
    auVar53._24_4_ = fVar138 * fVar138;
    auVar53._28_4_ = local_560._28_4_ + fStack_a44;
    fVar373 = auVar17._0_4_ + auVar17._0_4_;
    fVar379 = auVar17._4_4_ + auVar17._4_4_;
    local_580._0_8_ = CONCAT44(fVar379,fVar373);
    local_580._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    local_580._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    local_580._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    local_580._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    local_580._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    local_580._28_4_ = auVar17._28_4_ + auVar17._28_4_;
    auVar17 = vsubps_avx(local_640,auVar53);
    local_5c0._4_4_ = (uint)(fVar332 * fVar332);
    local_5c0._0_4_ = (uint)(fVar322 * fVar322);
    local_5c0._8_4_ = (uint)(fVar334 * fVar334);
    local_5c0._12_4_ = (uint)(fVar336 * fVar336);
    local_5c0._16_4_ = (uint)(fVar338 * fVar338);
    local_5c0._20_4_ = (uint)(fVar340 * fVar340);
    local_5c0._24_4_ = (uint)(fVar342 * fVar342);
    local_5c0._28_4_ = local_6a0._28_4_;
    local_6c0 = vsubps_avx(local_260,local_5c0);
    auVar350 = ZEXT3264(local_6c0);
    local_780._4_4_ = fVar379 * fVar379;
    local_780._0_4_ = fVar373 * fVar373;
    fStack_778 = local_580._8_4_ * local_580._8_4_;
    fStack_774 = local_580._12_4_ * local_580._12_4_;
    fStack_770 = local_580._16_4_ * local_580._16_4_;
    fStack_76c = local_580._20_4_ * local_580._20_4_;
    fStack_768 = local_580._24_4_ * local_580._24_4_;
    fStack_764 = 1.0000002;
    fVar131 = local_6c0._0_4_;
    local_7a0._0_4_ = fVar131 * 4.0;
    fVar133 = local_6c0._4_4_;
    local_7a0._4_4_ = fVar133 * 4.0;
    fVar135 = local_6c0._8_4_;
    fStack_798 = fVar135 * 4.0;
    fVar136 = local_6c0._12_4_;
    fStack_794 = fVar136 * 4.0;
    fVar137 = local_6c0._16_4_;
    fStack_790 = fVar137 * 4.0;
    fVar138 = local_6c0._20_4_;
    fStack_78c = fVar138 * 4.0;
    fVar351 = local_6c0._24_4_;
    fStack_788 = fVar351 * 4.0;
    uStack_784 = 0x40800000;
    auVar54._4_4_ = auVar17._4_4_ * (float)local_7a0._4_4_;
    auVar54._0_4_ = auVar17._0_4_ * (float)local_7a0._0_4_;
    auVar54._8_4_ = auVar17._8_4_ * fStack_798;
    auVar54._12_4_ = auVar17._12_4_ * fStack_794;
    auVar54._16_4_ = auVar17._16_4_ * fStack_790;
    auVar54._20_4_ = auVar17._20_4_ * fStack_78c;
    auVar54._24_4_ = auVar17._24_4_ * fStack_788;
    auVar54._28_4_ = 0x40800000;
    auVar18 = vsubps_avx(_local_780,auVar54);
    auVar123 = vcmpps_avx(auVar18,auVar160,5);
    fVar198 = local_6c0._28_4_;
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar376._8_4_ = 0xff800000;
      auVar376._0_8_ = 0xff800000ff800000;
      auVar376._12_4_ = 0xff800000;
      auVar376._16_4_ = 0xff800000;
      auVar376._20_4_ = 0xff800000;
      auVar376._24_4_ = 0xff800000;
      auVar376._28_4_ = 0xff800000;
      fVar373 = 0.0;
    }
    else {
      auVar327 = vsqrtps_avx(auVar18);
      auVar279._0_4_ = fVar131 + fVar131;
      auVar279._4_4_ = fVar133 + fVar133;
      auVar279._8_4_ = fVar135 + fVar135;
      auVar279._12_4_ = fVar136 + fVar136;
      auVar279._16_4_ = fVar137 + fVar137;
      auVar279._20_4_ = fVar138 + fVar138;
      auVar279._24_4_ = fVar351 + fVar351;
      auVar279._28_4_ = fVar198 + fVar198;
      auVar162 = vrcpps_avx(auVar279);
      auVar160 = vcmpps_avx(auVar18,auVar160,5);
      fVar219 = auVar162._0_4_;
      fVar234 = auVar162._4_4_;
      auVar55._4_4_ = auVar279._4_4_ * fVar234;
      auVar55._0_4_ = auVar279._0_4_ * fVar219;
      fVar236 = auVar162._8_4_;
      auVar55._8_4_ = auVar279._8_4_ * fVar236;
      fVar238 = auVar162._12_4_;
      auVar55._12_4_ = auVar279._12_4_ * fVar238;
      fVar240 = auVar162._16_4_;
      auVar55._16_4_ = auVar279._16_4_ * fVar240;
      fVar242 = auVar162._20_4_;
      auVar55._20_4_ = auVar279._20_4_ * fVar242;
      fVar244 = auVar162._24_4_;
      auVar55._24_4_ = auVar279._24_4_ * fVar244;
      auVar55._28_4_ = auVar18._28_4_;
      auVar161._8_4_ = 0x3f800000;
      auVar161._0_8_ = &DAT_3f8000003f800000;
      auVar161._12_4_ = 0x3f800000;
      auVar161._16_4_ = 0x3f800000;
      auVar161._20_4_ = 0x3f800000;
      auVar161._24_4_ = 0x3f800000;
      auVar161._28_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar161,auVar55);
      fVar219 = fVar219 + fVar219 * auVar18._0_4_;
      fVar234 = fVar234 + fVar234 * auVar18._4_4_;
      fVar236 = fVar236 + fVar236 * auVar18._8_4_;
      fVar238 = fVar238 + fVar238 * auVar18._12_4_;
      fVar240 = fVar240 + fVar240 * auVar18._16_4_;
      fVar242 = fVar242 + fVar242 * auVar18._20_4_;
      fVar244 = fVar244 + fVar244 * auVar18._24_4_;
      auVar280._0_8_ = CONCAT44(fVar379,fVar373) ^ 0x8000000080000000;
      auVar280._8_4_ = -local_580._8_4_;
      auVar280._12_4_ = -local_580._12_4_;
      auVar280._16_4_ = -local_580._16_4_;
      auVar280._20_4_ = -local_580._20_4_;
      auVar280._24_4_ = -local_580._24_4_;
      auVar280._28_4_ = -local_580._28_4_;
      auVar19 = vsubps_avx(auVar280,auVar327);
      fVar373 = auVar19._0_4_ * fVar219;
      fVar379 = auVar19._4_4_ * fVar234;
      auVar56._4_4_ = fVar379;
      auVar56._0_4_ = fVar373;
      fVar287 = auVar19._8_4_ * fVar236;
      auVar56._8_4_ = fVar287;
      fVar291 = auVar19._12_4_ * fVar238;
      auVar56._12_4_ = fVar291;
      fVar295 = auVar19._16_4_ * fVar240;
      auVar56._16_4_ = fVar295;
      fVar299 = auVar19._20_4_ * fVar242;
      auVar56._20_4_ = fVar299;
      fVar303 = auVar19._24_4_ * fVar244;
      auVar56._24_4_ = fVar303;
      auVar56._28_4_ = auVar19._28_4_;
      auVar327 = vsubps_avx(auVar327,local_580);
      fVar219 = auVar327._0_4_ * fVar219;
      fVar234 = auVar327._4_4_ * fVar234;
      auVar57._4_4_ = fVar234;
      auVar57._0_4_ = fVar219;
      fVar236 = auVar327._8_4_ * fVar236;
      auVar57._8_4_ = fVar236;
      fVar238 = auVar327._12_4_ * fVar238;
      auVar57._12_4_ = fVar238;
      fVar240 = auVar327._16_4_ * fVar240;
      auVar57._16_4_ = fVar240;
      fVar242 = auVar327._20_4_ * fVar242;
      auVar57._20_4_ = fVar242;
      fVar244 = auVar327._24_4_ * fVar244;
      auVar57._24_4_ = fVar244;
      auVar57._28_4_ = auVar327._28_4_;
      fStack_4c4 = local_6e0._28_4_ + auVar162._28_4_ + auVar18._28_4_;
      local_4e0[0] = fVar233 * (local_6e0._0_4_ + fVar322 * fVar373);
      local_4e0[1] = fVar266 * (local_6e0._4_4_ + fVar332 * fVar379);
      local_4e0[2] = fVar293 * (local_6e0._8_4_ + fVar334 * fVar287);
      local_4e0[3] = fVar317 * (local_6e0._12_4_ + fVar336 * fVar291);
      fStack_4d0 = fVar337 * (local_6e0._16_4_ + fVar338 * fVar295);
      fStack_4cc = fVar385 * (local_6e0._20_4_ + fVar340 * fVar299);
      fStack_4c8 = fVar271 * (local_6e0._24_4_ + fVar342 * fVar303);
      local_a60._4_4_ = fVar332;
      local_a60._0_4_ = fVar322;
      fStack_a58 = fVar334;
      fStack_a54 = fVar336;
      fStack_a50 = fVar338;
      fStack_a4c = fVar340;
      fStack_a48 = fVar342;
      fStack_a44 = fVar344;
      local_500[0] = fVar233 * (local_6e0._0_4_ + fVar322 * fVar219);
      local_500[1] = fVar266 * (local_6e0._4_4_ + fVar332 * fVar234);
      local_500[2] = fVar293 * (local_6e0._8_4_ + fVar334 * fVar236);
      local_500[3] = fVar317 * (local_6e0._12_4_ + fVar336 * fVar238);
      fStack_4f0 = fVar337 * (local_6e0._16_4_ + fVar338 * fVar240);
      fStack_4ec = fVar385 * (local_6e0._20_4_ + fVar340 * fVar242);
      fStack_4e8 = fVar271 * (local_6e0._24_4_ + fVar342 * fVar244);
      fStack_4e4 = local_6e0._28_4_ + fStack_4c4;
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar228 = vblendvps_avx(auVar229,auVar56,auVar160);
      auVar312._8_4_ = 0x7fffffff;
      auVar312._0_8_ = 0x7fffffff7fffffff;
      auVar312._12_4_ = 0x7fffffff;
      auVar312._16_4_ = 0x7fffffff;
      auVar312._20_4_ = 0x7fffffff;
      auVar312._24_4_ = 0x7fffffff;
      auVar312._28_4_ = 0x7fffffff;
      auVar18 = vandps_avx(local_5c0,auVar312);
      auVar18 = vmaxps_avx(local_400,auVar18);
      auVar58._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar58._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar58._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar58._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar58._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar58._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar58._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar58._28_4_ = auVar18._28_4_;
      auVar18 = vandps_avx(local_6c0,auVar312);
      auVar18 = vcmpps_avx(auVar18,auVar58,1);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar376 = vblendvps_avx(auVar281,auVar57,auVar160);
      auVar162 = auVar160 & auVar18;
      fVar373 = local_6e0._28_4_;
      if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar162 >> 0x7f,0) != '\0') ||
            (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar162 >> 0xbf,0) != '\0') ||
          (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar162[0x1f] < '\0') {
        auVar123 = vandps_avx(auVar18,auVar160);
        auVar146 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar18 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,2);
        auVar406._8_4_ = 0xff800000;
        auVar406._0_8_ = 0xff800000ff800000;
        auVar406._12_4_ = 0xff800000;
        auVar406._16_4_ = 0xff800000;
        auVar406._20_4_ = 0xff800000;
        auVar406._24_4_ = 0xff800000;
        auVar406._28_4_ = 0xff800000;
        auVar329._8_4_ = 0x7f800000;
        auVar329._0_8_ = 0x7f8000007f800000;
        auVar329._12_4_ = 0x7f800000;
        auVar329._16_4_ = 0x7f800000;
        auVar329._20_4_ = 0x7f800000;
        auVar329._24_4_ = 0x7f800000;
        auVar329._28_4_ = 0x7f800000;
        auVar17 = vblendvps_avx(auVar329,auVar406,auVar18);
        auVar109 = vpmovsxwd_avx(auVar146);
        auVar146 = vpunpckhwd_avx(auVar146,auVar146);
        auVar263._16_16_ = auVar146;
        auVar263._0_16_ = auVar109;
        auVar228 = vblendvps_avx(auVar228,auVar17,auVar263);
        auVar17 = vblendvps_avx(auVar406,auVar329,auVar18);
        auVar376 = vblendvps_avx(auVar376,auVar17,auVar263);
        auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar127._0_4_ = auVar123._0_4_ ^ auVar17._0_4_;
        auVar127._4_4_ = auVar123._4_4_ ^ auVar17._4_4_;
        auVar127._8_4_ = auVar123._8_4_ ^ auVar17._8_4_;
        auVar127._12_4_ = auVar123._12_4_ ^ auVar17._12_4_;
        auVar127._16_4_ = auVar123._16_4_ ^ auVar17._16_4_;
        auVar127._20_4_ = auVar123._20_4_ ^ auVar17._20_4_;
        auVar127._24_4_ = auVar123._24_4_ ^ auVar17._24_4_;
        auVar127._28_4_ = auVar123._28_4_ ^ auVar17._28_4_;
        auVar123 = vorps_avx(auVar18,auVar127);
        auVar123 = vandps_avx(auVar160,auVar123);
      }
    }
    auVar377 = ZEXT3264(auVar376);
    auVar357 = ZEXT3264(local_6e0);
    auVar17 = local_280 & auVar123;
    auVar253._8_4_ = 0x3f800000;
    auVar253._0_8_ = &DAT_3f8000003f800000;
    auVar253._12_4_ = 0x3f800000;
    auVar253._16_4_ = 0x3f800000;
    auVar253._20_4_ = 0x3f800000;
    auVar253._24_4_ = 0x3f800000;
    auVar253._28_4_ = 0x3f800000;
    auVar264 = ZEXT3264(auVar253);
    auVar284 = ZEXT3264(_local_820);
    auVar314 = ZEXT1664(local_910);
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      local_a60._4_4_ = fVar332;
      local_a60._0_4_ = fVar322;
      fStack_a58 = fVar334;
      fStack_a54 = fVar336;
      fStack_a50 = fVar338;
      fStack_a4c = fVar340;
      fStack_a48 = fVar342;
      fStack_a44 = fVar344;
      auVar146 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_));
      auVar146 = vshufps_avx(auVar146,auVar146,0);
      auVar254._16_16_ = auVar146;
      auVar254._0_16_ = auVar146;
      auVar18 = vmaxps_avx(auVar254,auVar228);
      auVar146 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7c0._0_4_));
      auVar146 = vshufps_avx(auVar146,auVar146,0);
      auVar255._16_16_ = auVar146;
      auVar255._0_16_ = auVar146;
      auVar160 = vminps_avx(auVar255,auVar376);
      fVar240 = auVar159._28_4_;
      auVar193._0_4_ = local_520 * fVar272 + local_540 * fVar372 + fVar386 * local_620;
      auVar193._4_4_ = fStack_51c * fVar285 + fStack_53c * fVar378 + fVar391 * fStack_61c;
      auVar193._8_4_ = fStack_518 * fVar286 + fStack_538 * fVar380 + fVar393 * fStack_618;
      auVar193._12_4_ = fStack_514 * fVar290 + fStack_534 * fVar381 + fVar395 * fStack_614;
      auVar193._16_4_ = fStack_510 * fVar294 + fStack_530 * fVar382 + fVar397 * fStack_610;
      auVar193._20_4_ = fStack_50c * fVar298 + fStack_52c * fVar383 + fVar399 * fStack_60c;
      auVar193._24_4_ = fStack_508 * fVar302 + fStack_528 * fVar384 + fVar401 * fStack_608;
      auVar193._28_4_ = fVar304 + fStack_184 + fVar240;
      auVar159 = vrcpps_avx(auVar193);
      fVar304 = auVar159._0_4_;
      fVar344 = auVar159._4_4_;
      auVar59._4_4_ = auVar193._4_4_ * fVar344;
      auVar59._0_4_ = auVar193._0_4_ * fVar304;
      fVar379 = auVar159._8_4_;
      auVar59._8_4_ = auVar193._8_4_ * fVar379;
      fVar219 = auVar159._12_4_;
      auVar59._12_4_ = auVar193._12_4_ * fVar219;
      fVar234 = auVar159._16_4_;
      auVar59._16_4_ = auVar193._16_4_ * fVar234;
      fVar236 = auVar159._20_4_;
      auVar59._20_4_ = auVar193._20_4_ * fVar236;
      fVar238 = auVar159._24_4_;
      auVar59._24_4_ = auVar193._24_4_ * fVar238;
      auVar59._28_4_ = fStack_184;
      auVar17 = vsubps_avx(auVar253,auVar59);
      auVar313._8_4_ = 0x7fffffff;
      auVar313._0_8_ = 0x7fffffff7fffffff;
      auVar313._12_4_ = 0x7fffffff;
      auVar313._16_4_ = 0x7fffffff;
      auVar313._20_4_ = 0x7fffffff;
      auVar313._24_4_ = 0x7fffffff;
      auVar313._28_4_ = 0x7fffffff;
      auVar159 = vandps_avx(auVar193,auVar313);
      auVar349._8_4_ = 0x219392ef;
      auVar349._0_8_ = 0x219392ef219392ef;
      auVar349._12_4_ = 0x219392ef;
      auVar349._16_4_ = 0x219392ef;
      auVar349._20_4_ = 0x219392ef;
      auVar349._24_4_ = 0x219392ef;
      auVar349._28_4_ = 0x219392ef;
      auVar350 = ZEXT3264(auVar349);
      auVar159 = vcmpps_avx(auVar159,auVar349,1);
      auVar364 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar60._4_4_ =
           (fVar344 + fVar344 * auVar17._4_4_) *
           -(fVar365 * fVar285 + fVar378 * fVar265 + fVar391 * fVar245);
      auVar60._0_4_ =
           (fVar304 + fVar304 * auVar17._0_4_) *
           -(fVar358 * fVar272 + fVar372 * fVar218 + fVar386 * fVar217);
      auVar60._8_4_ =
           (fVar379 + fVar379 * auVar17._8_4_) *
           -(fVar366 * fVar286 + fVar380 * fVar292 + fVar393 * fVar289);
      auVar60._12_4_ =
           (fVar219 + fVar219 * auVar17._12_4_) *
           -(fVar367 * fVar290 + fVar381 * fVar316 + fVar395 * fVar315);
      auVar60._16_4_ =
           (fVar234 + fVar234 * auVar17._16_4_) *
           -(fVar368 * fVar294 + fVar382 * fVar335 + fVar397 * fVar333);
      auVar60._20_4_ =
           (fVar236 + fVar236 * auVar17._20_4_) *
           -(fVar369 * fVar298 + fVar383 * fVar21 + fVar399 * fVar371);
      auVar60._24_4_ =
           (fVar238 + fVar238 * auVar17._24_4_) *
           -(fVar370 * fVar302 + fVar384 * fVar28 + fVar401 * fVar27);
      auVar60._28_4_ = -(fVar240 + fVar373 + fVar240);
      auVar327 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar17 = vcmpps_avx(auVar193,auVar327,1);
      auVar162 = vorps_avx(auVar159,auVar17);
      auVar17 = vcmpps_avx(auVar193,auVar327,6);
      auVar17 = vorps_avx(auVar159,auVar17);
      local_600._8_4_ = 0xff800000;
      local_600._0_8_ = 0xff800000ff800000;
      local_600._12_4_ = 0xff800000;
      local_600._16_4_ = 0xff800000;
      local_600._20_4_ = 0xff800000;
      local_600._24_4_ = 0xff800000;
      local_600._28_4_ = 0xff800000;
      auVar159 = vblendvps_avx(auVar60,local_600,auVar162);
      auVar405._8_4_ = 0x7f800000;
      auVar405._0_8_ = 0x7f8000007f800000;
      auVar405._12_4_ = 0x7f800000;
      auVar405._16_4_ = 0x7f800000;
      auVar405._20_4_ = 0x7f800000;
      auVar405._24_4_ = 0x7f800000;
      auVar405._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar60,auVar405,auVar17);
      auVar18 = vmaxps_avx(auVar18,auVar159);
      auVar160 = vminps_avx(auVar160,auVar17);
      auVar162 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar159 = vsubps_avx(auVar162,_local_880);
      auVar17 = vsubps_avx(auVar162,local_8a0);
      auVar61._4_4_ = auVar17._4_4_ * -fVar392;
      auVar61._0_4_ = auVar17._0_4_ * -fVar387;
      auVar61._8_4_ = auVar17._8_4_ * -fVar394;
      auVar61._12_4_ = auVar17._12_4_ * -fVar396;
      auVar61._16_4_ = auVar17._16_4_ * -fVar398;
      auVar61._20_4_ = auVar17._20_4_ * -fVar400;
      auVar61._24_4_ = auVar17._24_4_ * -fVar402;
      auVar61._28_4_ = auVar17._28_4_;
      auVar62._4_4_ = fVar241 * auVar159._4_4_;
      auVar62._0_4_ = fVar215 * auVar159._0_4_;
      auVar62._8_4_ = fVar270 * auVar159._8_4_;
      auVar62._12_4_ = fVar301 * auVar159._12_4_;
      auVar62._16_4_ = fVar321 * auVar159._16_4_;
      auVar62._20_4_ = fVar352 * auVar159._20_4_;
      auVar62._24_4_ = fVar25 * auVar159._24_4_;
      auVar62._28_4_ = auVar159._28_4_;
      auVar159 = vsubps_avx(auVar61,auVar62);
      auVar17 = vsubps_avx(auVar162,local_940);
      auVar63._4_4_ = fVar243 * auVar17._4_4_;
      auVar63._0_4_ = fVar216 * auVar17._0_4_;
      auVar63._8_4_ = fVar288 * auVar17._8_4_;
      auVar63._12_4_ = fVar305 * auVar17._12_4_;
      auVar63._16_4_ = fVar331 * auVar17._16_4_;
      auVar63._20_4_ = fVar353 * auVar17._20_4_;
      uVar1 = auVar17._28_4_;
      auVar63._24_4_ = fVar26 * auVar17._24_4_;
      auVar63._28_4_ = uVar1;
      auVar162 = vsubps_avx(auVar159,auVar63);
      auVar64._4_4_ = -fVar392 * fStack_61c;
      auVar64._0_4_ = -fVar387 * local_620;
      auVar64._8_4_ = -fVar394 * fStack_618;
      auVar64._12_4_ = -fVar396 * fStack_614;
      auVar64._16_4_ = -fVar398 * fStack_610;
      auVar64._20_4_ = -fVar400 * fStack_60c;
      auVar64._24_4_ = -fVar402 * fStack_608;
      auVar64._28_4_ = uVar15 ^ 0x80000000;
      auVar65._4_4_ = fStack_53c * fVar241;
      auVar65._0_4_ = local_540 * fVar215;
      auVar65._8_4_ = fStack_538 * fVar270;
      auVar65._12_4_ = fStack_534 * fVar301;
      auVar65._16_4_ = fStack_530 * fVar321;
      auVar65._20_4_ = fStack_52c * fVar352;
      auVar65._24_4_ = fStack_528 * fVar25;
      auVar65._28_4_ = uVar1;
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = &DAT_3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      auVar159 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = fStack_51c * fVar243;
      auVar66._0_4_ = local_520 * fVar216;
      auVar66._8_4_ = fStack_518 * fVar288;
      auVar66._12_4_ = fStack_514 * fVar305;
      auVar66._16_4_ = fStack_510 * fVar331;
      auVar66._20_4_ = fStack_50c * fVar353;
      auVar66._24_4_ = fStack_508 * fVar26;
      auVar66._28_4_ = uVar1;
      auVar327 = vsubps_avx(auVar159,auVar66);
      auVar159 = vrcpps_avx(auVar327);
      fVar215 = auVar159._0_4_;
      fVar216 = auVar159._4_4_;
      auVar67._4_4_ = auVar327._4_4_ * fVar216;
      auVar67._0_4_ = auVar327._0_4_ * fVar215;
      fVar217 = auVar159._8_4_;
      auVar67._8_4_ = auVar327._8_4_ * fVar217;
      fVar218 = auVar159._12_4_;
      auVar67._12_4_ = auVar327._12_4_ * fVar218;
      fVar241 = auVar159._16_4_;
      auVar67._16_4_ = auVar327._16_4_ * fVar241;
      fVar243 = auVar159._20_4_;
      auVar67._20_4_ = auVar327._20_4_ * fVar243;
      fVar245 = auVar159._24_4_;
      auVar67._24_4_ = auVar327._24_4_ * fVar245;
      auVar67._28_4_ = local_9e0._28_4_;
      auVar19 = vsubps_avx(auVar261,auVar67);
      auVar159 = vandps_avx(auVar327,auVar313);
      auVar17 = vcmpps_avx(auVar159,auVar349,1);
      auVar68._4_4_ = (fVar216 + fVar216 * auVar19._4_4_) * -auVar162._4_4_;
      auVar68._0_4_ = (fVar215 + fVar215 * auVar19._0_4_) * -auVar162._0_4_;
      auVar68._8_4_ = (fVar217 + fVar217 * auVar19._8_4_) * -auVar162._8_4_;
      auVar68._12_4_ = (fVar218 + fVar218 * auVar19._12_4_) * -auVar162._12_4_;
      auVar68._16_4_ = (fVar241 + fVar241 * auVar19._16_4_) * -auVar162._16_4_;
      auVar68._20_4_ = (fVar243 + fVar243 * auVar19._20_4_) * -auVar162._20_4_;
      auVar68._24_4_ = (fVar245 + fVar245 * auVar19._24_4_) * -auVar162._24_4_;
      auVar68._28_4_ = auVar162._28_4_ ^ 0x80000000;
      auVar159 = vcmpps_avx(auVar327,ZEXT832(0) << 0x20,1);
      auVar159 = vorps_avx(auVar17,auVar159);
      auVar159 = vblendvps_avx(auVar68,local_600,auVar159);
      local_420 = vmaxps_avx(auVar18,auVar159);
      auVar159 = vcmpps_avx(auVar327,ZEXT832(0) << 0x20,6);
      auVar159 = vorps_avx(auVar17,auVar159);
      auVar159 = vblendvps_avx(auVar68,auVar405,auVar159);
      auVar123 = vandps_avx(local_280,auVar123);
      local_480 = vminps_avx(auVar160,auVar159);
      auVar159 = vcmpps_avx(local_420,local_480,2);
      auVar17 = auVar123 & auVar159;
      auVar18 = auVar261;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar17 >> 0x7f,0) == '\0') &&
            (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0xbf,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f])
      {
LAB_010e827b:
        auVar377 = ZEXT3264(local_600);
        auVar357 = ZEXT3264(auVar18);
        auVar284 = ZEXT3264(_local_820);
      }
      else {
        auVar17 = vminps_avx(local_700,_local_760);
        auVar18 = vminps_avx(local_720,local_740);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar17 = vsubps_avx(auVar17,_local_560);
        auVar123 = vandps_avx(auVar159,auVar123);
        auVar96._4_4_ = local_4e0[1];
        auVar96._0_4_ = local_4e0[0];
        auVar96._8_4_ = local_4e0[2];
        auVar96._12_4_ = local_4e0[3];
        auVar96._16_4_ = fStack_4d0;
        auVar96._20_4_ = fStack_4cc;
        auVar96._24_4_ = fStack_4c8;
        auVar96._28_4_ = fStack_4c4;
        auVar159 = vminps_avx(auVar96,auVar261);
        auVar159 = vmaxps_avx(auVar159,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar104 + fVar139 * (auVar159._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar130 + fVar176 * (auVar159._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar132 + fVar177 * (auVar159._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar134 + fVar179 * (auVar159._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar104 + fVar139 * (auVar159._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar130 + fVar176 * (auVar159._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar132 + fVar177 * (auVar159._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar134 + auVar159._28_4_ + 7.0;
        auVar95._4_4_ = local_500[1];
        auVar95._0_4_ = local_500[0];
        auVar95._8_4_ = local_500[2];
        auVar95._12_4_ = local_500[3];
        auVar95._16_4_ = fStack_4f0;
        auVar95._20_4_ = fStack_4ec;
        auVar95._24_4_ = fStack_4e8;
        auVar95._28_4_ = fStack_4e4;
        auVar159 = vminps_avx(auVar95,auVar261);
        auVar159 = vmaxps_avx(auVar159,ZEXT832(0) << 0x20);
        local_500[0] = fVar104 + fVar139 * (auVar159._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar130 + fVar176 * (auVar159._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar132 + fVar177 * (auVar159._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar134 + fVar179 * (auVar159._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar104 + fVar139 * (auVar159._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar130 + fVar176 * (auVar159._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar132 + fVar177 * (auVar159._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar134 + auVar159._28_4_ + 7.0;
        auVar69._4_4_ = auVar17._4_4_ * 0.99999976;
        auVar69._0_4_ = auVar17._0_4_ * 0.99999976;
        auVar69._8_4_ = auVar17._8_4_ * 0.99999976;
        auVar69._12_4_ = auVar17._12_4_ * 0.99999976;
        auVar69._16_4_ = auVar17._16_4_ * 0.99999976;
        auVar69._20_4_ = auVar17._20_4_ * 0.99999976;
        auVar69._24_4_ = auVar17._24_4_ * 0.99999976;
        auVar69._28_4_ = 0x3f7ffffc;
        auVar159 = vmaxps_avx(ZEXT832(0) << 0x20,auVar69);
        auVar70._4_4_ = auVar159._4_4_ * auVar159._4_4_;
        auVar70._0_4_ = auVar159._0_4_ * auVar159._0_4_;
        auVar70._8_4_ = auVar159._8_4_ * auVar159._8_4_;
        auVar70._12_4_ = auVar159._12_4_ * auVar159._12_4_;
        auVar70._16_4_ = auVar159._16_4_ * auVar159._16_4_;
        auVar70._20_4_ = auVar159._20_4_ * auVar159._20_4_;
        auVar70._24_4_ = auVar159._24_4_ * auVar159._24_4_;
        auVar70._28_4_ = auVar159._28_4_;
        auVar17 = vsubps_avx(local_640,auVar70);
        auVar71._4_4_ = auVar17._4_4_ * (float)local_7a0._4_4_;
        auVar71._0_4_ = auVar17._0_4_ * (float)local_7a0._0_4_;
        auVar71._8_4_ = auVar17._8_4_ * fStack_798;
        auVar71._12_4_ = auVar17._12_4_ * fStack_794;
        auVar71._16_4_ = auVar17._16_4_ * fStack_790;
        auVar71._20_4_ = auVar17._20_4_ * fStack_78c;
        auVar71._24_4_ = auVar17._24_4_ * fStack_788;
        auVar71._28_4_ = auVar159._28_4_;
        auVar18 = vsubps_avx(_local_780,auVar71);
        auVar159 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0x7f,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar159 >> 0xbf,0) == '\0') &&
            (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar159[0x1f]) {
          auVar162 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar204 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar350 = ZEXT864(0) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
        }
        else {
          local_940 = auVar17;
          local_9c0 = auVar159;
          _local_880 = auVar123;
          auVar162 = vsqrtps_avx(auVar18);
          auVar209._0_4_ = fVar131 + fVar131;
          auVar209._4_4_ = fVar133 + fVar133;
          auVar209._8_4_ = fVar135 + fVar135;
          auVar209._12_4_ = fVar136 + fVar136;
          auVar209._16_4_ = fVar137 + fVar137;
          auVar209._20_4_ = fVar138 + fVar138;
          auVar209._24_4_ = fVar351 + fVar351;
          auVar209._28_4_ = fVar198 + fVar198;
          auVar160 = vrcpps_avx(auVar209);
          fVar198 = auVar160._0_4_;
          fVar215 = auVar160._4_4_;
          auVar72._4_4_ = auVar209._4_4_ * fVar215;
          auVar72._0_4_ = auVar209._0_4_ * fVar198;
          fVar216 = auVar160._8_4_;
          auVar72._8_4_ = auVar209._8_4_ * fVar216;
          fVar217 = auVar160._12_4_;
          auVar72._12_4_ = auVar209._12_4_ * fVar217;
          fVar218 = auVar160._16_4_;
          auVar72._16_4_ = auVar209._16_4_ * fVar218;
          fVar241 = auVar160._20_4_;
          auVar72._20_4_ = auVar209._20_4_ * fVar241;
          fVar243 = auVar160._24_4_;
          auVar72._24_4_ = auVar209._24_4_ * fVar243;
          auVar72._28_4_ = auVar209._28_4_;
          auVar327 = vsubps_avx(auVar261,auVar72);
          fVar198 = fVar198 + fVar198 * auVar327._0_4_;
          fVar215 = fVar215 + fVar215 * auVar327._4_4_;
          fVar216 = fVar216 + fVar216 * auVar327._8_4_;
          fVar217 = fVar217 + fVar217 * auVar327._12_4_;
          fVar218 = fVar218 + fVar218 * auVar327._16_4_;
          fVar241 = fVar241 + fVar241 * auVar327._20_4_;
          fVar243 = fVar243 + fVar243 * auVar327._24_4_;
          fVar245 = auVar160._28_4_ + auVar327._28_4_;
          auVar257._0_8_ = local_580._0_8_ ^ 0x8000000080000000;
          auVar257._8_4_ = -local_580._8_4_;
          auVar257._12_4_ = -local_580._12_4_;
          auVar257._16_4_ = -local_580._16_4_;
          auVar257._20_4_ = -local_580._20_4_;
          auVar257._24_4_ = -local_580._24_4_;
          auVar257._28_4_ = -local_580._28_4_;
          auVar160 = vsubps_avx(auVar257,auVar162);
          fVar315 = auVar160._0_4_ * fVar198;
          fVar316 = auVar160._4_4_ * fVar215;
          auVar73._4_4_ = fVar316;
          auVar73._0_4_ = fVar315;
          fVar321 = auVar160._8_4_ * fVar216;
          auVar73._8_4_ = fVar321;
          fVar331 = auVar160._12_4_ * fVar217;
          auVar73._12_4_ = fVar331;
          fVar333 = auVar160._16_4_ * fVar218;
          auVar73._16_4_ = fVar333;
          fVar335 = auVar160._20_4_ * fVar241;
          auVar73._20_4_ = fVar335;
          fVar352 = auVar160._24_4_ * fVar243;
          auVar73._24_4_ = fVar352;
          auVar73._28_4_ = local_280._28_4_;
          auVar162 = vsubps_avx(auVar162,local_580);
          fVar198 = auVar162._0_4_ * fVar198;
          fVar215 = auVar162._4_4_ * fVar215;
          auVar74._4_4_ = fVar215;
          auVar74._0_4_ = fVar198;
          fVar216 = auVar162._8_4_ * fVar216;
          auVar74._8_4_ = fVar216;
          fVar217 = auVar162._12_4_ * fVar217;
          auVar74._12_4_ = fVar217;
          fVar218 = auVar162._16_4_ * fVar218;
          auVar74._16_4_ = fVar218;
          fVar241 = auVar162._20_4_ * fVar241;
          auVar74._20_4_ = fVar241;
          fVar243 = auVar162._24_4_ * fVar243;
          auVar74._24_4_ = fVar243;
          auVar74._28_4_ = 0xff800000;
          fVar265 = fVar233 * (fVar315 * fVar322 + local_6e0._0_4_);
          fVar270 = fVar266 * (fVar316 * fVar332 + local_6e0._4_4_);
          fVar288 = fVar293 * (fVar321 * fVar334 + local_6e0._8_4_);
          fVar289 = fVar317 * (fVar331 * fVar336 + local_6e0._12_4_);
          fVar292 = fVar337 * (fVar333 * fVar338 + local_6e0._16_4_);
          fVar301 = fVar385 * (fVar335 * fVar340 + local_6e0._20_4_);
          fVar305 = fVar271 * (fVar352 * fVar342 + local_6e0._24_4_);
          auVar163._0_4_ = local_a80 + fVar214 * fVar265;
          auVar163._4_4_ = fStack_a7c + fVar239 * fVar270;
          auVar163._8_4_ = fStack_a78 + fVar269 * fVar288;
          auVar163._12_4_ = fStack_a74 + fVar300 * fVar289;
          auVar163._16_4_ = fStack_a70 + fVar320 * fVar292;
          auVar163._20_4_ = fStack_a6c + fVar343 * fVar301;
          auVar163._24_4_ = fStack_a68 + fVar24 * fVar305;
          auVar163._28_4_ = fStack_a64 + auVar162._28_4_ + local_6e0._28_4_;
          auVar75._4_4_ = fStack_51c * fVar316;
          auVar75._0_4_ = local_520 * fVar315;
          auVar75._8_4_ = fStack_518 * fVar321;
          auVar75._12_4_ = fStack_514 * fVar331;
          auVar75._16_4_ = fStack_510 * fVar333;
          auVar75._20_4_ = fStack_50c * fVar335;
          auVar75._24_4_ = fStack_508 * fVar352;
          auVar75._28_4_ = fVar245;
          auVar162 = vsubps_avx(auVar75,auVar163);
          local_8a0 = auVar162;
          auVar210._0_4_ = local_ac0 + fVar212 * fVar265;
          auVar210._4_4_ = fStack_abc + fVar235 * fVar270;
          auVar210._8_4_ = fStack_ab8 + fVar267 * fVar288;
          auVar210._12_4_ = fStack_ab4 + fVar296 * fVar289;
          auVar210._16_4_ = fStack_ab0 + fVar318 * fVar292;
          auVar210._20_4_ = fStack_aac + fVar339 * fVar301;
          auVar210._24_4_ = fStack_aa8 + fVar22 * fVar305;
          auVar210._28_4_ = fStack_aa4 + fVar245;
          auVar76._4_4_ = fStack_53c * fVar316;
          auVar76._0_4_ = local_540 * fVar315;
          auVar76._8_4_ = fStack_538 * fVar321;
          auVar76._12_4_ = fStack_534 * fVar331;
          auVar76._16_4_ = fStack_530 * fVar333;
          auVar76._20_4_ = fStack_52c * fVar335;
          auVar76._24_4_ = fStack_528 * fVar352;
          auVar76._28_4_ = fVar134;
          local_a00 = vsubps_avx(auVar76,auVar210);
          auVar258._0_4_ = local_aa0 + fVar213 * fVar265;
          auVar258._4_4_ = fStack_a9c + fVar237 * fVar270;
          auVar258._8_4_ = fStack_a98 + fVar268 * fVar288;
          auVar258._12_4_ = fStack_a94 + fVar297 * fVar289;
          auVar258._16_4_ = fStack_a90 + fVar319 * fVar292;
          auVar258._20_4_ = fStack_a8c + fVar341 * fVar301;
          auVar258._24_4_ = fStack_a88 + fVar23 * fVar305;
          auVar258._28_4_ = fStack_a84 + auVar160._28_4_;
          auVar77._4_4_ = fStack_61c * fVar316;
          auVar77._0_4_ = local_620 * fVar315;
          auVar77._8_4_ = fStack_618 * fVar321;
          auVar77._12_4_ = fStack_614 * fVar331;
          auVar77._16_4_ = fStack_610 * fVar333;
          auVar77._20_4_ = fStack_60c * fVar335;
          auVar77._24_4_ = fStack_608 * fVar352;
          auVar77._28_4_ = fVar134;
          local_840 = vsubps_avx(auVar77,auVar258);
          fVar233 = fVar233 * (fVar198 * fVar322 + local_6e0._0_4_);
          fVar266 = fVar266 * (fVar215 * fVar332 + local_6e0._4_4_);
          fVar293 = fVar293 * (fVar216 * fVar334 + local_6e0._8_4_);
          fVar317 = fVar317 * (fVar217 * fVar336 + local_6e0._12_4_);
          fVar337 = fVar337 * (fVar218 * fVar338 + local_6e0._16_4_);
          fVar385 = fVar385 * (fVar241 * fVar340 + local_6e0._20_4_);
          fVar271 = fVar271 * (fVar243 * fVar342 + local_6e0._24_4_);
          auVar282._0_4_ = local_a80 + fVar214 * fVar233;
          auVar282._4_4_ = fStack_a7c + fVar239 * fVar266;
          auVar282._8_4_ = fStack_a78 + fVar269 * fVar293;
          auVar282._12_4_ = fStack_a74 + fVar300 * fVar317;
          auVar282._16_4_ = fStack_a70 + fVar320 * fVar337;
          auVar282._20_4_ = fStack_a6c + fVar343 * fVar385;
          auVar282._24_4_ = fStack_a68 + fVar24 * fVar271;
          auVar282._28_4_ = fStack_a64 + fVar134;
          auVar78._4_4_ = fStack_51c * fVar215;
          auVar78._0_4_ = local_520 * fVar198;
          auVar78._8_4_ = fStack_518 * fVar216;
          auVar78._12_4_ = fStack_514 * fVar217;
          auVar78._16_4_ = fStack_510 * fVar218;
          auVar78._20_4_ = fStack_50c * fVar241;
          auVar78._24_4_ = fStack_508 * fVar243;
          auVar78._28_4_ = fStack_504;
          _local_6a0 = vsubps_avx(auVar78,auVar282);
          auVar283._0_4_ = local_ac0 + fVar212 * fVar233;
          auVar283._4_4_ = fStack_abc + fVar235 * fVar266;
          auVar283._8_4_ = fStack_ab8 + fVar267 * fVar293;
          auVar283._12_4_ = fStack_ab4 + fVar296 * fVar317;
          auVar283._16_4_ = fStack_ab0 + fVar318 * fVar337;
          auVar283._20_4_ = fStack_aac + fVar339 * fVar385;
          auVar283._24_4_ = fStack_aa8 + fVar22 * fVar271;
          auVar283._28_4_ = fStack_aa4 + local_6a0._28_4_;
          auVar79._4_4_ = fStack_53c * fVar215;
          auVar79._0_4_ = local_540 * fVar198;
          auVar79._8_4_ = fStack_538 * fVar216;
          auVar79._12_4_ = fStack_534 * fVar217;
          auVar79._16_4_ = fStack_530 * fVar218;
          auVar79._20_4_ = fStack_52c * fVar241;
          auVar79._24_4_ = fStack_528 * fVar243;
          auVar79._28_4_ = fStack_504;
          _local_680 = vsubps_avx(auVar79,auVar283);
          auVar259._0_4_ = local_aa0 + fVar213 * fVar233;
          auVar259._4_4_ = fStack_a9c + fVar237 * fVar266;
          auVar259._8_4_ = fStack_a98 + fVar268 * fVar293;
          auVar259._12_4_ = fStack_a94 + fVar297 * fVar317;
          auVar259._16_4_ = fStack_a90 + fVar319 * fVar337;
          auVar259._20_4_ = fStack_a8c + fVar341 * fVar385;
          auVar259._24_4_ = fStack_a88 + fVar23 * fVar271;
          auVar259._28_4_ = fStack_a84 + local_840._28_4_ + local_6e0._28_4_;
          auVar80._4_4_ = fStack_61c * fVar215;
          auVar80._0_4_ = local_620 * fVar198;
          auVar80._8_4_ = fStack_618 * fVar216;
          auVar80._12_4_ = fStack_614 * fVar217;
          auVar80._16_4_ = fStack_610 * fVar218;
          auVar80._20_4_ = fStack_60c * fVar241;
          auVar80._24_4_ = fStack_608 * fVar243;
          auVar80._28_4_ = local_680._28_4_;
          _local_660 = vsubps_avx(auVar80,auVar259);
          auVar160 = vcmpps_avx(auVar18,_DAT_02020f00,5);
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar231,auVar73,auVar160);
          auVar328._8_4_ = 0x7fffffff;
          auVar328._0_8_ = 0x7fffffff7fffffff;
          auVar328._12_4_ = 0x7fffffff;
          auVar328._16_4_ = 0x7fffffff;
          auVar328._20_4_ = 0x7fffffff;
          auVar328._24_4_ = 0x7fffffff;
          auVar328._28_4_ = 0x7fffffff;
          auVar18 = vandps_avx(auVar328,local_5c0);
          auVar18 = vmaxps_avx(local_400,auVar18);
          auVar81._4_4_ = auVar18._4_4_ * 1.9073486e-06;
          auVar81._0_4_ = auVar18._0_4_ * 1.9073486e-06;
          auVar81._8_4_ = auVar18._8_4_ * 1.9073486e-06;
          auVar81._12_4_ = auVar18._12_4_ * 1.9073486e-06;
          auVar81._16_4_ = auVar18._16_4_ * 1.9073486e-06;
          auVar81._20_4_ = auVar18._20_4_ * 1.9073486e-06;
          auVar81._24_4_ = auVar18._24_4_ * 1.9073486e-06;
          auVar81._28_4_ = auVar18._28_4_;
          auVar18 = vandps_avx(auVar328,local_6c0);
          auVar18 = vcmpps_avx(auVar18,auVar81,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar256 = vblendvps_avx(auVar260,auVar74,auVar160);
          auVar327 = auVar160 & auVar18;
          if ((((((((auVar327 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar327 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar327 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar327 >> 0x7f,0) != '\0') ||
                (auVar327 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar327 >> 0xbf,0) != '\0') ||
              (auVar327 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar327[0x1f] < '\0') {
            auVar159 = vandps_avx(auVar18,auVar160);
            auVar146 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
            auVar327 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar18 = vcmpps_avx(auVar17,auVar327,2);
            auVar407._8_4_ = 0xff800000;
            auVar407._0_8_ = 0xff800000ff800000;
            auVar407._12_4_ = 0xff800000;
            auVar407._16_4_ = 0xff800000;
            auVar407._20_4_ = 0xff800000;
            auVar407._24_4_ = 0xff800000;
            auVar407._28_4_ = 0xff800000;
            auVar408._8_4_ = 0x7f800000;
            auVar408._0_8_ = 0x7f8000007f800000;
            auVar408._12_4_ = 0x7f800000;
            auVar408._16_4_ = 0x7f800000;
            auVar408._20_4_ = 0x7f800000;
            auVar408._24_4_ = 0x7f800000;
            auVar408._28_4_ = 0x7f800000;
            auVar17 = vblendvps_avx(auVar408,auVar407,auVar18);
            auVar109 = vpmovsxwd_avx(auVar146);
            auVar146 = vpunpckhwd_avx(auVar146,auVar146);
            auVar330._16_16_ = auVar146;
            auVar330._0_16_ = auVar109;
            auVar230 = vblendvps_avx(auVar230,auVar17,auVar330);
            auVar17 = vblendvps_avx(auVar407,auVar408,auVar18);
            auVar256 = vblendvps_avx(auVar256,auVar17,auVar330);
            auVar17 = vcmpps_avx(auVar327,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar128._0_4_ = auVar17._0_4_ ^ auVar159._0_4_;
            auVar128._4_4_ = auVar17._4_4_ ^ auVar159._4_4_;
            auVar128._8_4_ = auVar17._8_4_ ^ auVar159._8_4_;
            auVar128._12_4_ = auVar17._12_4_ ^ auVar159._12_4_;
            auVar128._16_4_ = auVar17._16_4_ ^ auVar159._16_4_;
            auVar128._20_4_ = auVar17._20_4_ ^ auVar159._20_4_;
            auVar128._24_4_ = auVar17._24_4_ ^ auVar159._24_4_;
            auVar128._28_4_ = auVar17._28_4_ ^ auVar159._28_4_;
            auVar159 = vorps_avx(auVar18,auVar128);
            auVar159 = vandps_avx(auVar160,auVar159);
          }
          auVar204 = local_a00._0_28_;
          auVar350 = ZEXT3264(local_840);
        }
        local_780._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar198 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar363._4_4_ = fVar198;
        auVar363._0_4_ = fVar198;
        auVar363._8_4_ = fVar198;
        auVar363._12_4_ = fVar198;
        auVar363._16_4_ = fVar198;
        auVar363._20_4_ = fVar198;
        auVar363._24_4_ = fVar198;
        auVar363._28_4_ = fVar198;
        auVar364 = ZEXT3264(auVar363);
        fVar212 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar390._4_4_ = fVar212;
        auVar390._0_4_ = fVar212;
        auVar390._8_4_ = fVar212;
        auVar390._12_4_ = fVar212;
        auVar390._16_4_ = fVar212;
        auVar390._20_4_ = fVar212;
        auVar390._24_4_ = fVar212;
        auVar390._28_4_ = fVar212;
        local_460 = local_420;
        local_440 = vminps_avx(local_480,auVar230);
        _local_7a0 = vmaxps_avx(local_420,auVar256);
        _local_4a0 = _local_7a0;
        auVar17 = vcmpps_avx(local_420,local_440,2);
        local_580 = vandps_avx(auVar17,auVar123);
        local_5e0 = local_580;
        auVar17 = vcmpps_avx(_local_7a0,local_480,2);
        local_600 = vandps_avx(auVar17,auVar123);
        auVar123 = vorps_avx(local_600,local_580);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
          auVar261._8_4_ = 0x3f800000;
          auVar261._0_8_ = &DAT_3f8000003f800000;
          auVar261._12_4_ = 0x3f800000;
          auVar261._16_4_ = 0x3f800000;
          auVar261._20_4_ = 0x3f800000;
          auVar261._24_4_ = 0x3f800000;
          auVar261._28_4_ = 0x3f800000;
          auVar18 = _local_7a0;
          goto LAB_010e827b;
        }
        local_6e0 = local_600;
        auVar123 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar159._0_4_ ^ auVar123._0_4_;
        local_5c0._4_4_ = auVar159._4_4_ ^ auVar123._4_4_;
        local_5c0._8_4_ = auVar159._8_4_ ^ auVar123._8_4_;
        local_5c0._12_4_ = auVar159._12_4_ ^ auVar123._12_4_;
        local_5c0._16_4_ = auVar159._16_4_ ^ auVar123._16_4_;
        local_5c0._20_4_ = auVar159._20_4_ ^ auVar123._20_4_;
        local_5c0._24_4_ = auVar159._24_4_ ^ auVar123._24_4_;
        local_5c0._28_4_ = (uint)auVar159._28_4_ ^ (uint)auVar123._28_4_;
        auVar377 = ZEXT3264(auVar363);
        auVar357 = ZEXT3264(auVar390);
        auVar122._0_4_ =
             (float)local_780._0_4_ * auVar162._0_4_ +
             fVar198 * auVar204._0_4_ + auVar350._0_4_ * fVar212;
        auVar122._4_4_ =
             (float)local_780._0_4_ * auVar162._4_4_ +
             fVar198 * auVar204._4_4_ + auVar350._4_4_ * fVar212;
        auVar122._8_4_ =
             (float)local_780._0_4_ * auVar162._8_4_ +
             fVar198 * auVar204._8_4_ + auVar350._8_4_ * fVar212;
        auVar122._12_4_ =
             (float)local_780._0_4_ * auVar162._12_4_ +
             fVar198 * auVar204._12_4_ + auVar350._12_4_ * fVar212;
        auVar122._16_4_ =
             (float)local_780._0_4_ * auVar162._16_4_ +
             fVar198 * auVar204._16_4_ + auVar350._16_4_ * fVar212;
        auVar122._20_4_ =
             (float)local_780._0_4_ * auVar162._20_4_ +
             fVar198 * auVar204._20_4_ + auVar350._20_4_ * fVar212;
        auVar122._24_4_ =
             (float)local_780._0_4_ * auVar162._24_4_ +
             fVar198 * auVar204._24_4_ + auVar350._24_4_ * fVar212;
        auVar122._28_4_ = auVar159._28_4_ + auVar162._28_4_ + auVar123._28_4_;
        auVar165._8_4_ = 0x7fffffff;
        auVar165._0_8_ = 0x7fffffff7fffffff;
        auVar165._12_4_ = 0x7fffffff;
        auVar165._16_4_ = 0x7fffffff;
        auVar165._20_4_ = 0x7fffffff;
        auVar165._24_4_ = 0x7fffffff;
        auVar165._28_4_ = 0x7fffffff;
        auVar123 = vandps_avx(auVar122,auVar165);
        auVar166._8_4_ = 0x3e99999a;
        auVar166._0_8_ = 0x3e99999a3e99999a;
        auVar166._12_4_ = 0x3e99999a;
        auVar166._16_4_ = 0x3e99999a;
        auVar166._20_4_ = 0x3e99999a;
        auVar166._24_4_ = 0x3e99999a;
        auVar166._28_4_ = 0x3e99999a;
        auVar123 = vcmpps_avx(auVar123,auVar166,1);
        auVar123 = vorps_avx(local_5c0,auVar123);
        auVar167._8_4_ = 3;
        auVar167._0_8_ = 0x300000003;
        auVar167._12_4_ = 3;
        auVar167._16_4_ = 3;
        auVar167._20_4_ = 3;
        auVar167._24_4_ = 3;
        auVar167._28_4_ = 3;
        auVar194._8_4_ = 2;
        auVar194._0_8_ = 0x200000002;
        auVar194._12_4_ = 2;
        auVar194._16_4_ = 2;
        auVar194._20_4_ = 2;
        auVar194._24_4_ = 2;
        auVar194._28_4_ = 2;
        auVar123 = vblendvps_avx(auVar194,auVar167,auVar123);
        local_5a0 = ZEXT432((uint)uVar99);
        local_4b0 = vpshufd_avx(ZEXT416((uint)uVar99),0);
        auVar146 = vpcmpgtd_avx(auVar123._16_16_,local_4b0);
        auVar109 = vpcmpgtd_avx(auVar123._0_16_,local_4b0);
        auVar168._16_16_ = auVar146;
        auVar168._0_16_ = auVar109;
        auVar123 = vblendps_avx(ZEXT1632(auVar109),auVar168,0xf0);
        local_5e0 = vandnps_avx(auVar123,local_580);
        auVar264 = ZEXT3264(local_5e0);
        local_6c0 = auVar123;
        auVar159 = local_580 & ~auVar123;
        auVar284 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_640._0_8_ = uVar99;
        local_780._4_4_ = local_780._0_4_;
        fStack_778 = (float)local_780._0_4_;
        fStack_774 = (float)local_780._0_4_;
        fStack_770 = (float)local_780._0_4_;
        fStack_76c = (float)local_780._0_4_;
        fStack_768 = (float)local_780._0_4_;
        local_9e0 = auVar20;
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0x7f,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0xbf,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar159[0x1f] < '\0') {
          local_560._4_4_ = local_420._4_4_ + (float)local_820._4_4_;
          local_560._0_4_ = local_420._0_4_ + (float)local_820._0_4_;
          fStack_558 = local_420._8_4_ + fStack_818;
          fStack_554 = local_420._12_4_ + fStack_814;
          fStack_550 = local_420._16_4_ + fStack_810;
          fStack_54c = local_420._20_4_ + fStack_80c;
          fStack_548 = local_420._24_4_ + fStack_808;
          fStack_544 = local_420._28_4_ + fStack_804;
          local_8c0 = auVar363;
          local_860 = auVar390;
          fStack_764 = (float)local_780._0_4_;
          do {
            auVar220 = auVar284._0_16_;
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar123 = auVar264._0_32_;
            auVar159 = vblendvps_avx(auVar169,local_420,auVar123);
            auVar17 = vshufps_avx(auVar159,auVar159,0xb1);
            auVar17 = vminps_avx(auVar159,auVar17);
            auVar18 = vshufpd_avx(auVar17,auVar17,5);
            auVar17 = vminps_avx(auVar17,auVar18);
            auVar18 = vperm2f128_avx(auVar17,auVar17,1);
            auVar17 = vminps_avx(auVar17,auVar18);
            auVar159 = vcmpps_avx(auVar159,auVar17,0);
            auVar17 = auVar123 & auVar159;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar123 = vandps_avx(auVar159,auVar123);
            }
            uVar100 = vmovmskps_avx(auVar123);
            uVar15 = 0;
            if (uVar100 != 0) {
              for (; (uVar100 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar99 = (ulong)uVar15;
            *(undefined4 *)(local_5e0 + uVar99 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_880 = (undefined1  [16])aVar5;
            auVar146 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_4e0[uVar99];
            auVar264 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_460 + uVar99 * 4);
            auVar314 = ZEXT464((uint)local_ac0);
            if (auVar146._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar198 = sqrtf(auVar146._0_4_);
              auVar314 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar264 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar220._8_4_ = 0x7fffffff;
              auVar220._0_8_ = 0x7fffffff7fffffff;
              auVar220._12_4_ = 0x7fffffff;
            }
            else {
              auVar146 = vsqrtss_avx(auVar146,auVar146);
              fVar198 = auVar146._0_4_;
            }
            auVar109 = vminps_avx(_local_970,_local_990);
            auVar146 = vmaxps_avx(_local_970,_local_990);
            auVar181 = vminps_avx(_local_980,_local_9a0);
            auVar143 = vminps_avx(auVar109,auVar181);
            auVar109 = vmaxps_avx(_local_980,_local_9a0);
            auVar181 = vmaxps_avx(auVar146,auVar109);
            auVar146 = vandps_avx(auVar143,auVar220);
            auVar109 = vandps_avx(auVar181,auVar220);
            auVar146 = vmaxps_avx(auVar146,auVar109);
            auVar109 = vmovshdup_avx(auVar146);
            auVar109 = vmaxss_avx(auVar109,auVar146);
            auVar146 = vshufpd_avx(auVar146,auVar146,1);
            auVar146 = vmaxss_avx(auVar146,auVar109);
            local_8a0._0_4_ = auVar146._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar198 * 1.9073486e-06;
            _local_760 = vshufps_avx(auVar181,auVar181,0xff);
            lVar101 = 4;
            do {
              local_aa0 = auVar264._0_4_;
              fVar216 = 1.0 - local_aa0;
              fVar198 = fVar216 * fVar216;
              fVar212 = fVar216 * fVar198;
              fVar213 = local_aa0 * local_aa0;
              fVar214 = local_aa0 * fVar213;
              fVar215 = local_aa0 * fVar216;
              local_a00._0_4_ = fVar215;
              auVar146 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                     ZEXT416((uint)(fVar214 * 0.16666667)),0);
              auVar109 = ZEXT416((uint)((fVar214 * 4.0 + fVar212 +
                                        local_aa0 * fVar215 * 12.0 + fVar216 * fVar215 * 6.0) *
                                       0.16666667));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar181 = ZEXT416((uint)((fVar212 * 4.0 + fVar214 +
                                        fVar216 * fVar215 * 12.0 + local_aa0 * fVar215 * 6.0) *
                                       0.16666667));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar403 = auVar314._0_16_;
              auVar143 = vshufps_avx(auVar403,auVar403,0);
              auVar182._0_4_ = auVar143._0_4_ * (float)local_880._0_4_ + 0.0;
              auVar182._4_4_ = auVar143._4_4_ * (float)local_880._4_4_ + 0.0;
              auVar182._8_4_ = auVar143._8_4_ * fStack_878 + 0.0;
              auVar182._12_4_ = auVar143._12_4_ * fStack_874 + 0.0;
              auVar143 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.16666667)),
                                     ZEXT416((uint)(fVar212 * 0.16666667)),0);
              auVar107._0_4_ =
                   auVar143._0_4_ * (float)local_970._0_4_ +
                   auVar181._0_4_ * (float)local_990._0_4_ +
                   auVar146._0_4_ * (float)local_9a0._0_4_ + auVar109._0_4_ * (float)local_980._0_4_
              ;
              auVar107._4_4_ =
                   auVar143._4_4_ * (float)local_970._4_4_ +
                   auVar181._4_4_ * (float)local_990._4_4_ +
                   auVar146._4_4_ * (float)local_9a0._4_4_ + auVar109._4_4_ * (float)local_980._4_4_
              ;
              auVar107._8_4_ =
                   auVar143._8_4_ * fStack_968 +
                   auVar181._8_4_ * fStack_988 +
                   auVar146._8_4_ * fStack_998 + auVar109._8_4_ * fStack_978;
              auVar107._12_4_ =
                   auVar143._12_4_ * fStack_964 +
                   auVar181._12_4_ * fStack_984 +
                   auVar146._12_4_ * fStack_994 + auVar109._12_4_ * fStack_974;
              local_840._0_16_ = auVar107;
              auVar146 = vsubps_avx(auVar182,auVar107);
              _local_a60 = auVar146;
              auVar146 = vdpps_avx(auVar146,auVar146,0x7f);
              local_a80 = auVar146._0_4_;
              auVar388 = auVar264._0_16_;
              fStack_a9c = auVar264._4_4_;
              fStack_a98 = auVar264._8_4_;
              fStack_a94 = auVar264._12_4_;
              local_ac0 = auVar314._0_4_;
              fStack_abc = auVar314._4_4_;
              fStack_ab8 = auVar314._8_4_;
              fStack_ab4 = auVar314._12_4_;
              fStack_a7c = auVar146._4_4_;
              fStack_a78 = auVar146._8_4_;
              fStack_a74 = auVar146._12_4_;
              if (local_a80 < 0.0) {
                local_9c0._0_16_ = ZEXT416((uint)fVar216);
                local_940._0_4_ = fVar213;
                local_9e0._0_4_ = fVar198;
                fVar212 = sqrtf(local_a80);
                auVar403._4_4_ = fStack_abc;
                auVar403._0_4_ = local_ac0;
                auVar403._8_4_ = fStack_ab8;
                auVar403._12_4_ = fStack_ab4;
                auVar388._4_4_ = fStack_a9c;
                auVar388._0_4_ = local_aa0;
                auVar388._8_4_ = fStack_a98;
                auVar388._12_4_ = fStack_a94;
                fVar198 = (float)local_9e0._0_4_;
                fVar213 = (float)local_940._0_4_;
                auVar146 = local_9c0._0_16_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar146,auVar146);
                fVar212 = auVar146._0_4_;
                auVar146 = ZEXT416((uint)fVar216);
              }
              fVar214 = auVar146._0_4_;
              fVar215 = auVar388._0_4_;
              auVar109 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.5)),ZEXT416((uint)(fVar213 * 0.5)),0
                                    );
              auVar181 = ZEXT416((uint)((fVar198 + (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar143 = ZEXT416((uint)((fVar215 * -fVar215 - (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar143 = vshufps_avx(auVar143,auVar143,0);
              auVar108 = ZEXT416((uint)(fVar214 * -fVar214 * 0.5));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar345._0_4_ =
                   (float)local_970._0_4_ * auVar108._0_4_ +
                   (float)local_990._0_4_ * auVar143._0_4_ +
                   (float)local_9a0._0_4_ * auVar109._0_4_ + (float)local_980._0_4_ * auVar181._0_4_
              ;
              auVar345._4_4_ =
                   (float)local_970._4_4_ * auVar108._4_4_ +
                   (float)local_990._4_4_ * auVar143._4_4_ +
                   (float)local_9a0._4_4_ * auVar109._4_4_ + (float)local_980._4_4_ * auVar181._4_4_
              ;
              auVar345._8_4_ =
                   fStack_968 * auVar108._8_4_ +
                   fStack_988 * auVar143._8_4_ +
                   fStack_998 * auVar109._8_4_ + fStack_978 * auVar181._8_4_;
              auVar345._12_4_ =
                   fStack_964 * auVar108._12_4_ +
                   fStack_984 * auVar143._12_4_ +
                   fStack_994 * auVar109._12_4_ + fStack_974 * auVar181._12_4_;
              auVar181 = vshufps_avx(auVar388,auVar388,0);
              auVar109 = ZEXT416((uint)(fVar214 - (fVar215 + fVar215)));
              auVar143 = vshufps_avx(auVar109,auVar109,0);
              auVar109 = ZEXT416((uint)(fVar215 - (fVar214 + fVar214)));
              auVar108 = vshufps_avx(auVar109,auVar109,0);
              auVar146 = vshufps_avx(auVar146,auVar146,0);
              auVar109 = vdpps_avx(auVar345,auVar345,0x7f);
              auVar144._0_4_ =
                   (float)local_970._0_4_ * auVar146._0_4_ +
                   (float)local_990._0_4_ * auVar108._0_4_ +
                   (float)local_9a0._0_4_ * auVar181._0_4_ + (float)local_980._0_4_ * auVar143._0_4_
              ;
              auVar144._4_4_ =
                   (float)local_970._4_4_ * auVar146._4_4_ +
                   (float)local_990._4_4_ * auVar108._4_4_ +
                   (float)local_9a0._4_4_ * auVar181._4_4_ + (float)local_980._4_4_ * auVar143._4_4_
              ;
              auVar144._8_4_ =
                   fStack_968 * auVar146._8_4_ +
                   fStack_988 * auVar108._8_4_ +
                   fStack_998 * auVar181._8_4_ + fStack_978 * auVar143._8_4_;
              auVar144._12_4_ =
                   fStack_964 * auVar146._12_4_ +
                   fStack_984 * auVar108._12_4_ +
                   fStack_994 * auVar181._12_4_ + fStack_974 * auVar143._12_4_;
              auVar146 = vblendps_avx(auVar109,_DAT_01feba10,0xe);
              auVar181 = vrsqrtss_avx(auVar146,auVar146);
              fVar213 = auVar181._0_4_;
              fVar198 = auVar109._0_4_;
              auVar181 = vdpps_avx(auVar345,auVar144,0x7f);
              auVar143 = vshufps_avx(auVar109,auVar109,0);
              auVar145._0_4_ = auVar144._0_4_ * auVar143._0_4_;
              auVar145._4_4_ = auVar144._4_4_ * auVar143._4_4_;
              auVar145._8_4_ = auVar144._8_4_ * auVar143._8_4_;
              auVar145._12_4_ = auVar144._12_4_ * auVar143._12_4_;
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar221._0_4_ = auVar345._0_4_ * auVar181._0_4_;
              auVar221._4_4_ = auVar345._4_4_ * auVar181._4_4_;
              auVar221._8_4_ = auVar345._8_4_ * auVar181._8_4_;
              auVar221._12_4_ = auVar345._12_4_ * auVar181._12_4_;
              auVar108 = vsubps_avx(auVar145,auVar221);
              auVar181 = vrcpss_avx(auVar146,auVar146);
              auVar146 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(auVar403._0_4_ * (float)local_7e0._0_4_)));
              auVar181 = ZEXT416((uint)(auVar181._0_4_ * (2.0 - fVar198 * auVar181._0_4_)));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              uVar99 = CONCAT44(auVar345._4_4_,auVar345._0_4_);
              auVar359._0_8_ = uVar99 ^ 0x8000000080000000;
              auVar359._8_4_ = -auVar345._8_4_;
              auVar359._12_4_ = -auVar345._12_4_;
              auVar143 = ZEXT416((uint)(fVar213 * 1.5 + fVar198 * -0.5 * fVar213 * fVar213 * fVar213
                                       ));
              auVar143 = vshufps_avx(auVar143,auVar143,0);
              auVar200._0_4_ = auVar143._0_4_ * auVar108._0_4_ * auVar181._0_4_;
              auVar200._4_4_ = auVar143._4_4_ * auVar108._4_4_ * auVar181._4_4_;
              auVar200._8_4_ = auVar143._8_4_ * auVar108._8_4_ * auVar181._8_4_;
              auVar200._12_4_ = auVar143._12_4_ * auVar108._12_4_ * auVar181._12_4_;
              local_960._0_4_ = auVar345._0_4_ * auVar143._0_4_;
              local_960._4_4_ = auVar345._4_4_ * auVar143._4_4_;
              local_960._8_4_ = auVar345._8_4_ * auVar143._8_4_;
              local_960._12_4_ = auVar345._12_4_ * auVar143._12_4_;
              local_a00._0_16_ = auVar345;
              local_9c0._0_4_ = auVar146._0_4_;
              if (fVar198 < 0.0) {
                local_940._0_4_ = fVar212;
                local_9e0._0_16_ = auVar359;
                local_800._0_16_ = auVar200;
                fVar213 = sqrtf(fVar198);
                auVar200 = local_800._0_16_;
                auVar359 = local_9e0._0_16_;
                fVar198 = (float)local_9c0._0_4_;
              }
              else {
                auVar109 = vsqrtss_avx(auVar109,auVar109);
                fVar213 = auVar109._0_4_;
                local_940._0_4_ = fVar212;
                fVar198 = auVar146._0_4_;
              }
              auVar323._4_4_ = fStack_a7c;
              auVar323._0_4_ = local_a80;
              auVar323._8_4_ = fStack_a78;
              auVar323._12_4_ = fStack_a74;
              auVar146 = vdpps_avx(_local_a60,local_960._0_16_,0x7f);
              local_9e0._0_4_ =
                   ((float)local_8a0._0_4_ / fVar213) * ((float)local_940._0_4_ + 1.0) +
                   fVar198 + (float)local_940._0_4_ * (float)local_8a0._0_4_;
              auVar109 = vdpps_avx(auVar359,local_960._0_16_,0x7f);
              auVar181 = vdpps_avx(_local_a60,auVar200,0x7f);
              auVar143 = vdpps_avx(_local_880,local_960._0_16_,0x7f);
              auVar108 = vdpps_avx(_local_a60,auVar359,0x7f);
              fVar212 = auVar109._0_4_ + auVar181._0_4_;
              fVar213 = auVar146._0_4_;
              auVar110._0_4_ = fVar213 * fVar213;
              auVar110._4_4_ = auVar146._4_4_ * auVar146._4_4_;
              auVar110._8_4_ = auVar146._8_4_ * auVar146._8_4_;
              auVar110._12_4_ = auVar146._12_4_ * auVar146._12_4_;
              auVar181 = vsubps_avx(auVar323,auVar110);
              local_960._0_16_ = ZEXT416((uint)fVar212);
              auVar109 = vdpps_avx(_local_a60,_local_880,0x7f);
              fVar214 = auVar108._0_4_ - fVar213 * fVar212;
              local_940._0_16_ = auVar146;
              fVar213 = auVar109._0_4_ - fVar213 * auVar143._0_4_;
              auVar146 = vrsqrtss_avx(auVar181,auVar181);
              fVar215 = auVar181._0_4_;
              fVar212 = auVar146._0_4_;
              fVar212 = fVar212 * 1.5 + fVar215 * -0.5 * fVar212 * fVar212 * fVar212;
              if (fVar215 < 0.0) {
                local_800._0_16_ = auVar143;
                local_700._0_4_ = fVar214;
                local_720._0_4_ = fVar213;
                local_740._0_4_ = fVar212;
                fVar215 = sqrtf(fVar215);
                auVar323._4_4_ = fStack_a7c;
                auVar323._0_4_ = local_a80;
                auVar323._8_4_ = fStack_a78;
                auVar323._12_4_ = fStack_a74;
                fVar212 = (float)local_740._0_4_;
                fVar214 = (float)local_700._0_4_;
                fVar213 = (float)local_720._0_4_;
                auVar143 = local_800._0_16_;
                fVar198 = (float)local_9c0._0_4_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar181,auVar181);
                fVar215 = auVar146._0_4_;
              }
              auVar377 = ZEXT3264(local_8c0);
              auVar357 = ZEXT3264(local_860);
              auVar350 = ZEXT1664(local_a00._0_16_);
              auVar109 = vpermilps_avx(local_840._0_16_,0xff);
              auVar108 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              fVar214 = fVar214 * fVar212 - auVar108._0_4_;
              auVar222._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar143._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar143._12_4_ ^ 0x80000000;
              auVar248._0_4_ = -fVar214;
              auVar248._4_4_ = 0x80000000;
              auVar248._8_4_ = 0x80000000;
              auVar248._12_4_ = 0x80000000;
              auVar364 = ZEXT1664(local_960._0_16_);
              auVar146 = vinsertps_avx(ZEXT416((uint)(fVar213 * fVar212)),auVar222,0x10);
              auVar181 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar213 * fVar212 -
                                                     auVar143._0_4_ * fVar214)));
              auVar146 = vdivps_avx(auVar146,auVar181);
              auVar143 = ZEXT416((uint)(fVar215 - auVar109._0_4_));
              auVar109 = vinsertps_avx(local_940._0_16_,auVar143,0x10);
              auVar201._0_4_ = auVar109._0_4_ * auVar146._0_4_;
              auVar201._4_4_ = auVar109._4_4_ * auVar146._4_4_;
              auVar201._8_4_ = auVar109._8_4_ * auVar146._8_4_;
              auVar201._12_4_ = auVar109._12_4_ * auVar146._12_4_;
              auVar146 = vinsertps_avx(auVar248,local_960._0_16_,0x1c);
              auVar146 = vdivps_avx(auVar146,auVar181);
              auVar183._0_4_ = auVar109._0_4_ * auVar146._0_4_;
              auVar183._4_4_ = auVar109._4_4_ * auVar146._4_4_;
              auVar183._8_4_ = auVar109._8_4_ * auVar146._8_4_;
              auVar183._12_4_ = auVar109._12_4_ * auVar146._12_4_;
              auVar146 = vhaddps_avx(auVar201,auVar201);
              auVar109 = vhaddps_avx(auVar183,auVar183);
              local_aa0 = local_aa0 - auVar146._0_4_;
              auVar264 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar109._0_4_;
              auVar314 = ZEXT464((uint)local_ac0);
              auVar223._8_4_ = 0x7fffffff;
              auVar223._0_8_ = 0x7fffffff7fffffff;
              auVar223._12_4_ = 0x7fffffff;
              auVar284 = ZEXT1664(auVar223);
              auVar146 = vandps_avx(local_940._0_16_,auVar223);
              if ((float)local_9e0._0_4_ <= auVar146._0_4_) {
LAB_010e8cdb:
                bVar82 = false;
              }
              else {
                auVar146 = vandps_avx(auVar143,auVar223);
                if ((float)local_760._0_4_ * 1.9073486e-06 + fVar198 + (float)local_9e0._0_4_ <=
                    auVar146._0_4_) goto LAB_010e8cdb;
                local_ac0 = local_ac0 + (float)local_7c0._0_4_;
                auVar314 = ZEXT464((uint)local_ac0);
                bVar82 = true;
                if ((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                    (fVar198 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar198)) &&
                   ((0.0 <= local_aa0 && (local_aa0 <= 1.0)))) {
                  auVar146 = vrsqrtss_avx(auVar323,auVar323);
                  fVar212 = auVar146._0_4_;
                  pGVar13 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar146 = ZEXT416((uint)(fVar212 * 1.5 +
                                             auVar323._0_4_ * -0.5 * fVar212 * fVar212 * fVar212));
                    auVar146 = vshufps_avx(auVar146,auVar146,0);
                    auVar147._0_4_ = auVar146._0_4_ * (float)local_a60._0_4_;
                    auVar147._4_4_ = auVar146._4_4_ * (float)local_a60._4_4_;
                    auVar147._8_4_ = auVar146._8_4_ * fStack_a58;
                    auVar147._12_4_ = auVar146._12_4_ * fStack_a54;
                    auVar111._0_4_ = local_a00._0_4_ + auVar108._0_4_ * auVar147._0_4_;
                    auVar111._4_4_ = local_a00._4_4_ + auVar108._4_4_ * auVar147._4_4_;
                    auVar111._8_4_ = local_a00._8_4_ + auVar108._8_4_ * auVar147._8_4_;
                    auVar111._12_4_ = local_a00._12_4_ + auVar108._12_4_ * auVar147._12_4_;
                    auVar146 = vshufps_avx(auVar147,auVar147,0xc9);
                    auVar109 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar148._0_4_ = auVar109._0_4_ * auVar147._0_4_;
                    auVar148._4_4_ = auVar109._4_4_ * auVar147._4_4_;
                    auVar148._8_4_ = auVar109._8_4_ * auVar147._8_4_;
                    auVar148._12_4_ = auVar109._12_4_ * auVar147._12_4_;
                    auVar184._0_4_ = local_a00._0_4_ * auVar146._0_4_;
                    auVar184._4_4_ = local_a00._4_4_ * auVar146._4_4_;
                    auVar184._8_4_ = local_a00._8_4_ * auVar146._8_4_;
                    auVar184._12_4_ = local_a00._12_4_ * auVar146._12_4_;
                    auVar181 = vsubps_avx(auVar184,auVar148);
                    auVar146 = vshufps_avx(auVar181,auVar181,0xc9);
                    auVar109 = vshufps_avx(auVar111,auVar111,0xc9);
                    auVar185._0_4_ = auVar109._0_4_ * auVar146._0_4_;
                    auVar185._4_4_ = auVar109._4_4_ * auVar146._4_4_;
                    auVar185._8_4_ = auVar109._8_4_ * auVar146._8_4_;
                    auVar185._12_4_ = auVar109._12_4_ * auVar146._12_4_;
                    auVar146 = vshufps_avx(auVar181,auVar181,0xd2);
                    auVar112._0_4_ = auVar111._0_4_ * auVar146._0_4_;
                    auVar112._4_4_ = auVar111._4_4_ * auVar146._4_4_;
                    auVar112._8_4_ = auVar111._8_4_ * auVar146._8_4_;
                    auVar112._12_4_ = auVar111._12_4_ * auVar146._12_4_;
                    auVar146 = vsubps_avx(auVar185,auVar112);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar109 = vshufps_avx(auVar146,auVar146,0xe9);
                      uVar2 = vmovlps_avx(auVar109);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar146._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = uVar98;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar109 = vshufps_avx(auVar146,auVar146,0xe9);
                      local_900 = vmovlps_avx(auVar109);
                      local_8f8 = auVar146._0_4_;
                      local_8f4 = local_aa0;
                      local_8f0 = 0;
                      local_8ec = uVar98;
                      local_8e8 = (uint)local_ac8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a30.valid = &local_acc;
                      local_a30.geometryUserPtr = pGVar13->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_900;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a80 = fVar198;
                      if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010e8e20:
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                            auVar350 = ZEXT1664(auVar350._0_16_);
                            auVar364 = ZEXT1664(auVar364._0_16_);
                            (*p_Var14)(&local_a30);
                            auVar314 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar264 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar357 = ZEXT3264(local_860);
                            auVar377 = ZEXT3264(local_8c0);
                            auVar284 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a30.valid == 0) goto LAB_010e8ee5;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar350 = ZEXT1664(local_a00._0_16_);
                        auVar364 = ZEXT1664(local_960._0_16_);
                        (*pGVar13->intersectionFilterN)(&local_a30);
                        auVar314 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar264 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar357 = ZEXT3264(local_860);
                        auVar377 = ZEXT3264(local_8c0);
                        auVar284 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a30.valid != 0) goto LAB_010e8e20;
LAB_010e8ee5:
                        (ray->super_RayK<1>).tfar = local_a80;
                      }
                    }
                  }
                }
              }
              auVar159 = local_5e0;
              bVar103 = lVar101 != 0;
              lVar101 = lVar101 + -1;
            } while ((!bVar82) && (bVar103));
            fVar198 = (ray->super_RayK<1>).tfar;
            auVar124._4_4_ = fVar198;
            auVar124._0_4_ = fVar198;
            auVar124._8_4_ = fVar198;
            auVar124._12_4_ = fVar198;
            auVar124._16_4_ = fVar198;
            auVar124._20_4_ = fVar198;
            auVar124._24_4_ = fVar198;
            auVar124._28_4_ = fVar198;
            auVar123 = vcmpps_avx(_local_560,auVar124,2);
            local_5e0 = vandps_avx(auVar123,local_5e0);
            auVar264 = ZEXT3264(local_5e0);
            auVar159 = auVar159 & auVar123;
            uVar99 = local_640._0_8_;
          } while ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar159 >> 0x7f,0) != '\0') ||
                     (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar159 >> 0xbf,0) != '\0') ||
                   (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar159[0x1f] < '\0');
        }
        auVar125._0_4_ =
             (float)local_780._0_4_ * (float)local_6a0._0_4_ +
             auVar377._0_4_ * (float)local_680._0_4_ + auVar357._0_4_ * (float)local_660._0_4_;
        auVar125._4_4_ =
             (float)local_780._4_4_ * (float)local_6a0._4_4_ +
             auVar377._4_4_ * (float)local_680._4_4_ + auVar357._4_4_ * (float)local_660._4_4_;
        auVar125._8_4_ =
             fStack_778 * fStack_698 + auVar377._8_4_ * fStack_678 + auVar357._8_4_ * fStack_658;
        auVar125._12_4_ =
             fStack_774 * fStack_694 + auVar377._12_4_ * fStack_674 + auVar357._12_4_ * fStack_654;
        auVar125._16_4_ =
             fStack_770 * fStack_690 + auVar377._16_4_ * fStack_670 + auVar357._16_4_ * fStack_650;
        auVar125._20_4_ =
             fStack_76c * fStack_68c + auVar377._20_4_ * fStack_66c + auVar357._20_4_ * fStack_64c;
        auVar125._24_4_ =
             fStack_768 * fStack_688 + auVar377._24_4_ * fStack_668 + auVar357._24_4_ * fStack_648;
        auVar125._28_4_ = auVar123._28_4_ + auVar123._28_4_ + auVar264._28_4_;
        auVar170._8_4_ = 0x7fffffff;
        auVar170._0_8_ = 0x7fffffff7fffffff;
        auVar170._12_4_ = 0x7fffffff;
        auVar170._16_4_ = 0x7fffffff;
        auVar170._20_4_ = 0x7fffffff;
        auVar170._24_4_ = 0x7fffffff;
        auVar170._28_4_ = 0x7fffffff;
        auVar123 = vandps_avx(auVar125,auVar170);
        auVar171._8_4_ = 0x3e99999a;
        auVar171._0_8_ = 0x3e99999a3e99999a;
        auVar171._12_4_ = 0x3e99999a;
        auVar171._16_4_ = 0x3e99999a;
        auVar171._20_4_ = 0x3e99999a;
        auVar171._24_4_ = 0x3e99999a;
        auVar171._28_4_ = 0x3e99999a;
        auVar123 = vcmpps_avx(auVar123,auVar171,1);
        auVar159 = vorps_avx(auVar123,local_5c0);
        auVar172._0_4_ = local_7a0._0_4_ + (float)local_820._0_4_;
        auVar172._4_4_ = local_7a0._4_4_ + (float)local_820._4_4_;
        auVar172._8_4_ = local_7a0._8_4_ + fStack_818;
        auVar172._12_4_ = local_7a0._12_4_ + fStack_814;
        auVar172._16_4_ = local_7a0._16_4_ + fStack_810;
        auVar172._20_4_ = local_7a0._20_4_ + fStack_80c;
        auVar172._24_4_ = local_7a0._24_4_ + fStack_808;
        auVar172._28_4_ = local_7a0._28_4_ + fStack_804;
        fVar198 = (ray->super_RayK<1>).tfar;
        auVar195._4_4_ = fVar198;
        auVar195._0_4_ = fVar198;
        auVar195._8_4_ = fVar198;
        auVar195._12_4_ = fVar198;
        auVar195._16_4_ = fVar198;
        auVar195._20_4_ = fVar198;
        auVar195._24_4_ = fVar198;
        auVar195._28_4_ = fVar198;
        auVar123 = vcmpps_avx(auVar172,auVar195,2);
        _local_780 = vandps_avx(auVar123,local_6e0);
        auVar173._8_4_ = 3;
        auVar173._0_8_ = 0x300000003;
        auVar173._12_4_ = 3;
        auVar173._16_4_ = 3;
        auVar173._20_4_ = 3;
        auVar173._24_4_ = 3;
        auVar173._28_4_ = 3;
        auVar196._8_4_ = 2;
        auVar196._0_8_ = 0x200000002;
        auVar196._12_4_ = 2;
        auVar196._16_4_ = 2;
        auVar196._20_4_ = 2;
        auVar196._24_4_ = 2;
        auVar196._28_4_ = 2;
        auVar123 = vblendvps_avx(auVar196,auVar173,auVar159);
        auVar146 = vpcmpgtd_avx(auVar123._16_16_,local_4b0);
        auVar109 = vpshufd_avx(local_5a0._0_16_,0);
        auVar109 = vpcmpgtd_avx(auVar123._0_16_,auVar109);
        auVar174._16_16_ = auVar146;
        auVar174._0_16_ = auVar109;
        _local_7a0 = vblendps_avx(ZEXT1632(auVar109),auVar174,0xf0);
        local_600 = vandnps_avx(_local_7a0,_local_780);
        auVar123 = _local_780 & ~_local_7a0;
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0x7f,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0xbf,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar123[0x1f] < '\0') {
          local_740 = _local_4a0;
          local_760._4_4_ = (float)local_4a0._4_4_ + (float)local_820._4_4_;
          local_760._0_4_ = (float)local_4a0._0_4_ + (float)local_820._0_4_;
          fStack_758 = fStack_498 + fStack_818;
          fStack_754 = fStack_494 + fStack_814;
          fStack_750 = fStack_490 + fStack_810;
          fStack_74c = fStack_48c + fStack_80c;
          fStack_748 = fStack_488 + fStack_808;
          fStack_744 = fStack_484 + fStack_804;
          do {
            auVar224 = auVar284._0_16_;
            auVar175._8_4_ = 0x7f800000;
            auVar175._0_8_ = 0x7f8000007f800000;
            auVar175._12_4_ = 0x7f800000;
            auVar175._16_4_ = 0x7f800000;
            auVar175._20_4_ = 0x7f800000;
            auVar175._24_4_ = 0x7f800000;
            auVar175._28_4_ = 0x7f800000;
            auVar123 = vblendvps_avx(auVar175,local_740,local_600);
            auVar159 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar159 = vminps_avx(auVar123,auVar159);
            auVar17 = vshufpd_avx(auVar159,auVar159,5);
            auVar159 = vminps_avx(auVar159,auVar17);
            auVar17 = vperm2f128_avx(auVar159,auVar159,1);
            auVar159 = vminps_avx(auVar159,auVar17);
            auVar159 = vcmpps_avx(auVar123,auVar159,0);
            auVar17 = local_600 & auVar159;
            auVar123 = local_600;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar123 = vandps_avx(auVar159,local_600);
            }
            uVar100 = vmovmskps_avx(auVar123);
            uVar15 = 0;
            if (uVar100 != 0) {
              for (; (uVar100 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar99 = (ulong)uVar15;
            *(undefined4 *)(local_600 + uVar99 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_880 = (undefined1  [16])aVar5;
            auVar146 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_500[uVar99];
            auVar357 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_480 + uVar99 * 4);
            auVar364 = ZEXT464((uint)local_ac0);
            if (auVar146._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar198 = sqrtf(auVar146._0_4_);
              auVar364 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar357 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar224._8_4_ = 0x7fffffff;
              auVar224._0_8_ = 0x7fffffff7fffffff;
              auVar224._12_4_ = 0x7fffffff;
            }
            else {
              auVar146 = vsqrtss_avx(auVar146,auVar146);
              fVar198 = auVar146._0_4_;
            }
            auVar109 = vminps_avx(_local_970,_local_990);
            auVar146 = vmaxps_avx(_local_970,_local_990);
            auVar181 = vminps_avx(_local_980,_local_9a0);
            auVar143 = vminps_avx(auVar109,auVar181);
            auVar109 = vmaxps_avx(_local_980,_local_9a0);
            auVar181 = vmaxps_avx(auVar146,auVar109);
            auVar146 = vandps_avx(auVar143,auVar224);
            auVar109 = vandps_avx(auVar181,auVar224);
            auVar146 = vmaxps_avx(auVar146,auVar109);
            auVar109 = vmovshdup_avx(auVar146);
            auVar109 = vmaxss_avx(auVar109,auVar146);
            auVar146 = vshufpd_avx(auVar146,auVar146,1);
            auVar146 = vmaxss_avx(auVar146,auVar109);
            local_8a0._0_4_ = auVar146._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar198 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar181,auVar181,0xff);
            lVar101 = 4;
            do {
              local_aa0 = auVar357._0_4_;
              fVar216 = 1.0 - local_aa0;
              fVar198 = fVar216 * fVar216;
              fVar212 = fVar216 * fVar198;
              fVar213 = local_aa0 * local_aa0;
              fVar214 = local_aa0 * fVar213;
              fVar215 = local_aa0 * fVar216;
              local_a00._0_4_ = fVar215;
              auVar146 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                     ZEXT416((uint)(fVar214 * 0.16666667)),0);
              auVar109 = ZEXT416((uint)((fVar214 * 4.0 + fVar212 +
                                        local_aa0 * fVar215 * 12.0 + fVar216 * fVar215 * 6.0) *
                                       0.16666667));
              auVar109 = vshufps_avx(auVar109,auVar109,0);
              auVar181 = ZEXT416((uint)((fVar212 * 4.0 + fVar214 +
                                        fVar216 * fVar215 * 12.0 + local_aa0 * fVar215 * 6.0) *
                                       0.16666667));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar360 = auVar364._0_16_;
              auVar143 = vshufps_avx(auVar360,auVar360,0);
              auVar186._0_4_ = auVar143._0_4_ * (float)local_880._0_4_ + 0.0;
              auVar186._4_4_ = auVar143._4_4_ * (float)local_880._4_4_ + 0.0;
              auVar186._8_4_ = auVar143._8_4_ * fStack_878 + 0.0;
              auVar186._12_4_ = auVar143._12_4_ * fStack_874 + 0.0;
              auVar143 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.16666667)),
                                     ZEXT416((uint)(fVar212 * 0.16666667)),0);
              auVar113._0_4_ =
                   auVar143._0_4_ * (float)local_970._0_4_ +
                   auVar181._0_4_ * (float)local_990._0_4_ +
                   auVar146._0_4_ * (float)local_9a0._0_4_ + auVar109._0_4_ * (float)local_980._0_4_
              ;
              auVar113._4_4_ =
                   auVar143._4_4_ * (float)local_970._4_4_ +
                   auVar181._4_4_ * (float)local_990._4_4_ +
                   auVar146._4_4_ * (float)local_9a0._4_4_ + auVar109._4_4_ * (float)local_980._4_4_
              ;
              auVar113._8_4_ =
                   auVar143._8_4_ * fStack_968 +
                   auVar181._8_4_ * fStack_988 +
                   auVar146._8_4_ * fStack_998 + auVar109._8_4_ * fStack_978;
              auVar113._12_4_ =
                   auVar143._12_4_ * fStack_964 +
                   auVar181._12_4_ * fStack_984 +
                   auVar146._12_4_ * fStack_994 + auVar109._12_4_ * fStack_974;
              local_840._0_16_ = auVar113;
              auVar146 = vsubps_avx(auVar186,auVar113);
              _local_a60 = auVar146;
              auVar146 = vdpps_avx(auVar146,auVar146,0x7f);
              local_a80 = auVar146._0_4_;
              auVar354 = auVar357._0_16_;
              fStack_a9c = auVar357._4_4_;
              fStack_a98 = auVar357._8_4_;
              fStack_a94 = auVar357._12_4_;
              local_ac0 = auVar364._0_4_;
              fStack_abc = auVar364._4_4_;
              fStack_ab8 = auVar364._8_4_;
              fStack_ab4 = auVar364._12_4_;
              fStack_a7c = auVar146._4_4_;
              fStack_a78 = auVar146._8_4_;
              fStack_a74 = auVar146._12_4_;
              if (local_a80 < 0.0) {
                local_9c0._0_16_ = ZEXT416((uint)fVar216);
                local_9e0._0_4_ = fVar213;
                local_960._0_4_ = fVar198;
                fVar212 = sqrtf(local_a80);
                auVar360._4_4_ = fStack_abc;
                auVar360._0_4_ = local_ac0;
                auVar360._8_4_ = fStack_ab8;
                auVar360._12_4_ = fStack_ab4;
                auVar354._4_4_ = fStack_a9c;
                auVar354._0_4_ = local_aa0;
                auVar354._8_4_ = fStack_a98;
                auVar354._12_4_ = fStack_a94;
                fVar198 = (float)local_960._0_4_;
                fVar213 = (float)local_9e0._0_4_;
                auVar146 = local_9c0._0_16_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar146,auVar146);
                fVar212 = auVar146._0_4_;
                auVar146 = ZEXT416((uint)fVar216);
              }
              fVar215 = auVar146._0_4_;
              fVar214 = auVar354._0_4_;
              auVar109 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.5)),ZEXT416((uint)(fVar213 * 0.5)),0
                                    );
              auVar181 = ZEXT416((uint)((fVar198 + (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar143 = ZEXT416((uint)((fVar214 * -fVar214 - (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar143 = vshufps_avx(auVar143,auVar143,0);
              auVar108 = ZEXT416((uint)(fVar215 * -fVar215 * 0.5));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar346._0_4_ =
                   (float)local_970._0_4_ * auVar108._0_4_ +
                   (float)local_990._0_4_ * auVar143._0_4_ +
                   (float)local_9a0._0_4_ * auVar109._0_4_ + (float)local_980._0_4_ * auVar181._0_4_
              ;
              auVar346._4_4_ =
                   (float)local_970._4_4_ * auVar108._4_4_ +
                   (float)local_990._4_4_ * auVar143._4_4_ +
                   (float)local_9a0._4_4_ * auVar109._4_4_ + (float)local_980._4_4_ * auVar181._4_4_
              ;
              auVar346._8_4_ =
                   fStack_968 * auVar108._8_4_ +
                   fStack_988 * auVar143._8_4_ +
                   fStack_998 * auVar109._8_4_ + fStack_978 * auVar181._8_4_;
              auVar346._12_4_ =
                   fStack_964 * auVar108._12_4_ +
                   fStack_984 * auVar143._12_4_ +
                   fStack_994 * auVar109._12_4_ + fStack_974 * auVar181._12_4_;
              auVar181 = vshufps_avx(auVar354,auVar354,0);
              auVar109 = ZEXT416((uint)(fVar215 - (fVar214 + fVar214)));
              auVar143 = vshufps_avx(auVar109,auVar109,0);
              auVar109 = ZEXT416((uint)(fVar214 - (fVar215 + fVar215)));
              auVar108 = vshufps_avx(auVar109,auVar109,0);
              auVar146 = vshufps_avx(auVar146,auVar146,0);
              auVar109 = vdpps_avx(auVar346,auVar346,0x7f);
              auVar149._0_4_ =
                   (float)local_970._0_4_ * auVar146._0_4_ +
                   (float)local_990._0_4_ * auVar108._0_4_ +
                   (float)local_9a0._0_4_ * auVar181._0_4_ + (float)local_980._0_4_ * auVar143._0_4_
              ;
              auVar149._4_4_ =
                   (float)local_970._4_4_ * auVar146._4_4_ +
                   (float)local_990._4_4_ * auVar108._4_4_ +
                   (float)local_9a0._4_4_ * auVar181._4_4_ + (float)local_980._4_4_ * auVar143._4_4_
              ;
              auVar149._8_4_ =
                   fStack_968 * auVar146._8_4_ +
                   fStack_988 * auVar108._8_4_ +
                   fStack_998 * auVar181._8_4_ + fStack_978 * auVar143._8_4_;
              auVar149._12_4_ =
                   fStack_964 * auVar146._12_4_ +
                   fStack_984 * auVar108._12_4_ +
                   fStack_994 * auVar181._12_4_ + fStack_974 * auVar143._12_4_;
              auVar146 = vblendps_avx(auVar109,_DAT_01feba10,0xe);
              auVar181 = vrsqrtss_avx(auVar146,auVar146);
              fVar213 = auVar181._0_4_;
              fVar198 = auVar109._0_4_;
              auVar181 = vdpps_avx(auVar346,auVar149,0x7f);
              auVar143 = vshufps_avx(auVar109,auVar109,0);
              auVar150._0_4_ = auVar149._0_4_ * auVar143._0_4_;
              auVar150._4_4_ = auVar149._4_4_ * auVar143._4_4_;
              auVar150._8_4_ = auVar149._8_4_ * auVar143._8_4_;
              auVar150._12_4_ = auVar149._12_4_ * auVar143._12_4_;
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar225._0_4_ = auVar346._0_4_ * auVar181._0_4_;
              auVar225._4_4_ = auVar346._4_4_ * auVar181._4_4_;
              auVar225._8_4_ = auVar346._8_4_ * auVar181._8_4_;
              auVar225._12_4_ = auVar346._12_4_ * auVar181._12_4_;
              auVar108 = vsubps_avx(auVar150,auVar225);
              auVar181 = vrcpss_avx(auVar146,auVar146);
              auVar146 = vmaxss_avx(ZEXT416((uint)local_8a0._0_4_),
                                    ZEXT416((uint)(auVar360._0_4_ * (float)local_940._0_4_)));
              auVar377 = ZEXT1664(auVar146);
              auVar181 = ZEXT416((uint)(auVar181._0_4_ * (2.0 - fVar198 * auVar181._0_4_)));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              uVar99 = CONCAT44(auVar346._4_4_,auVar346._0_4_);
              auVar249._0_8_ = uVar99 ^ 0x8000000080000000;
              auVar249._8_4_ = -auVar346._8_4_;
              auVar249._12_4_ = -auVar346._12_4_;
              auVar143 = ZEXT416((uint)(fVar213 * 1.5 + fVar198 * -0.5 * fVar213 * fVar213 * fVar213
                                       ));
              auVar143 = vshufps_avx(auVar143,auVar143,0);
              auVar202._0_4_ = auVar143._0_4_ * auVar108._0_4_ * auVar181._0_4_;
              auVar202._4_4_ = auVar143._4_4_ * auVar108._4_4_ * auVar181._4_4_;
              auVar202._8_4_ = auVar143._8_4_ * auVar108._8_4_ * auVar181._8_4_;
              auVar202._12_4_ = auVar143._12_4_ * auVar108._12_4_ * auVar181._12_4_;
              auVar275._0_4_ = auVar346._0_4_ * auVar143._0_4_;
              auVar275._4_4_ = auVar346._4_4_ * auVar143._4_4_;
              auVar275._8_4_ = auVar346._8_4_ * auVar143._8_4_;
              auVar275._12_4_ = auVar346._12_4_ * auVar143._12_4_;
              local_a00._0_16_ = auVar346;
              local_9c0._0_4_ = auVar146._0_4_;
              if (fVar198 < 0.0) {
                local_9e0._0_4_ = fVar212;
                local_960._0_16_ = auVar249;
                local_7e0._0_16_ = auVar275;
                local_8c0._0_16_ = auVar202;
                fVar198 = sqrtf(fVar198);
                auVar377 = ZEXT464((uint)local_9c0._0_4_);
                auVar202 = local_8c0._0_16_;
                auVar249 = local_960._0_16_;
                auVar275 = local_7e0._0_16_;
                fVar212 = (float)local_9e0._0_4_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar109,auVar109);
                fVar198 = auVar146._0_4_;
              }
              auVar324._4_4_ = fStack_a7c;
              auVar324._0_4_ = local_a80;
              auVar324._8_4_ = fStack_a78;
              auVar324._12_4_ = fStack_a74;
              auVar146 = vdpps_avx(_local_a60,auVar275,0x7f);
              fVar198 = ((float)local_8a0._0_4_ / fVar198) * (fVar212 + 1.0) +
                        auVar377._0_4_ + fVar212 * (float)local_8a0._0_4_;
              auVar109 = vdpps_avx(auVar249,auVar275,0x7f);
              auVar181 = vdpps_avx(_local_a60,auVar202,0x7f);
              auVar143 = vdpps_avx(_local_880,auVar275,0x7f);
              auVar108 = vdpps_avx(_local_a60,auVar249,0x7f);
              fVar212 = auVar109._0_4_ + auVar181._0_4_;
              fVar213 = auVar146._0_4_;
              auVar114._0_4_ = fVar213 * fVar213;
              auVar114._4_4_ = auVar146._4_4_ * auVar146._4_4_;
              auVar114._8_4_ = auVar146._8_4_ * auVar146._8_4_;
              auVar114._12_4_ = auVar146._12_4_ * auVar146._12_4_;
              auVar181 = vsubps_avx(auVar324,auVar114);
              auVar109 = vdpps_avx(_local_a60,_local_880,0x7f);
              fVar214 = auVar108._0_4_ - fVar213 * fVar212;
              fVar215 = auVar109._0_4_ - fVar213 * auVar143._0_4_;
              auVar109 = vrsqrtss_avx(auVar181,auVar181);
              fVar216 = auVar181._0_4_;
              fVar213 = auVar109._0_4_;
              fVar213 = fVar213 * 1.5 + fVar216 * -0.5 * fVar213 * fVar213 * fVar213;
              if (fVar216 < 0.0) {
                local_9e0._0_16_ = auVar146;
                local_960._0_4_ = fVar198;
                local_7e0._0_16_ = ZEXT416((uint)fVar212);
                local_8c0._0_16_ = auVar143;
                local_860._0_4_ = fVar214;
                local_800._0_4_ = fVar215;
                local_700._0_4_ = fVar213;
                fVar216 = sqrtf(fVar216);
                auVar377 = ZEXT464((uint)local_9c0._0_4_);
                auVar324._4_4_ = fStack_a7c;
                auVar324._0_4_ = local_a80;
                auVar324._8_4_ = fStack_a78;
                auVar324._12_4_ = fStack_a74;
                fVar213 = (float)local_700._0_4_;
                fVar214 = (float)local_860._0_4_;
                fVar215 = (float)local_800._0_4_;
                auVar143 = local_8c0._0_16_;
                fVar198 = (float)local_960._0_4_;
                auVar146 = local_9e0._0_16_;
                auVar109 = local_7e0._0_16_;
              }
              else {
                auVar109 = vsqrtss_avx(auVar181,auVar181);
                fVar216 = auVar109._0_4_;
                auVar109 = ZEXT416((uint)fVar212);
              }
              auVar350 = ZEXT1664(local_a00._0_16_);
              auVar151 = vpermilps_avx(local_840._0_16_,0xff);
              auVar6 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              fVar212 = fVar214 * fVar213 - auVar6._0_4_;
              auVar226._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar143._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar143._12_4_ ^ 0x80000000;
              auVar250._0_4_ = -fVar212;
              auVar250._4_4_ = 0x80000000;
              auVar250._8_4_ = 0x80000000;
              auVar250._12_4_ = 0x80000000;
              auVar181 = vinsertps_avx(ZEXT416((uint)(fVar215 * fVar213)),auVar226,0x10);
              auVar108 = vmovsldup_avx(ZEXT416((uint)(auVar109._0_4_ * fVar215 * fVar213 -
                                                     auVar143._0_4_ * fVar212)));
              auVar181 = vdivps_avx(auVar181,auVar108);
              auVar151 = ZEXT416((uint)(fVar216 - auVar151._0_4_));
              auVar143 = vinsertps_avx(auVar146,auVar151,0x10);
              auVar203._0_4_ = auVar143._0_4_ * auVar181._0_4_;
              auVar203._4_4_ = auVar143._4_4_ * auVar181._4_4_;
              auVar203._8_4_ = auVar143._8_4_ * auVar181._8_4_;
              auVar203._12_4_ = auVar143._12_4_ * auVar181._12_4_;
              auVar109 = vinsertps_avx(auVar250,auVar109,0x1c);
              auVar109 = vdivps_avx(auVar109,auVar108);
              auVar187._0_4_ = auVar143._0_4_ * auVar109._0_4_;
              auVar187._4_4_ = auVar143._4_4_ * auVar109._4_4_;
              auVar187._8_4_ = auVar143._8_4_ * auVar109._8_4_;
              auVar187._12_4_ = auVar143._12_4_ * auVar109._12_4_;
              auVar109 = vhaddps_avx(auVar203,auVar203);
              auVar181 = vhaddps_avx(auVar187,auVar187);
              local_aa0 = local_aa0 - auVar109._0_4_;
              auVar357 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar181._0_4_;
              auVar364 = ZEXT464((uint)local_ac0);
              auVar227._8_4_ = 0x7fffffff;
              auVar227._0_8_ = 0x7fffffff7fffffff;
              auVar227._12_4_ = 0x7fffffff;
              auVar284 = ZEXT1664(auVar227);
              auVar146 = vandps_avx(auVar146,auVar227);
              if (fVar198 <= auVar146._0_4_) {
LAB_010e984c:
                bVar82 = false;
              }
              else {
                auVar146 = vandps_avx(auVar151,auVar227);
                if ((float)local_720._0_4_ * 1.9073486e-06 + auVar377._0_4_ + fVar198 <=
                    auVar146._0_4_) goto LAB_010e984c;
                local_ac0 = local_ac0 + (float)local_7c0._0_4_;
                auVar364 = ZEXT464((uint)local_ac0);
                bVar82 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                     (fVar198 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar198)) &&
                    (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                  auVar146 = vrsqrtss_avx(auVar324,auVar324);
                  fVar212 = auVar146._0_4_;
                  pGVar13 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar146 = ZEXT416((uint)(fVar212 * 1.5 +
                                             auVar324._0_4_ * -0.5 * fVar212 * fVar212 * fVar212));
                    auVar146 = vshufps_avx(auVar146,auVar146,0);
                    auVar152._0_4_ = auVar146._0_4_ * (float)local_a60._0_4_;
                    auVar152._4_4_ = auVar146._4_4_ * (float)local_a60._4_4_;
                    auVar152._8_4_ = auVar146._8_4_ * fStack_a58;
                    auVar152._12_4_ = auVar146._12_4_ * fStack_a54;
                    auVar115._0_4_ = local_a00._0_4_ + auVar6._0_4_ * auVar152._0_4_;
                    auVar115._4_4_ = local_a00._4_4_ + auVar6._4_4_ * auVar152._4_4_;
                    auVar115._8_4_ = local_a00._8_4_ + auVar6._8_4_ * auVar152._8_4_;
                    auVar115._12_4_ = local_a00._12_4_ + auVar6._12_4_ * auVar152._12_4_;
                    auVar146 = vshufps_avx(auVar152,auVar152,0xc9);
                    auVar109 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar153._0_4_ = auVar109._0_4_ * auVar152._0_4_;
                    auVar153._4_4_ = auVar109._4_4_ * auVar152._4_4_;
                    auVar153._8_4_ = auVar109._8_4_ * auVar152._8_4_;
                    auVar153._12_4_ = auVar109._12_4_ * auVar152._12_4_;
                    auVar188._0_4_ = local_a00._0_4_ * auVar146._0_4_;
                    auVar188._4_4_ = local_a00._4_4_ * auVar146._4_4_;
                    auVar188._8_4_ = local_a00._8_4_ * auVar146._8_4_;
                    auVar188._12_4_ = local_a00._12_4_ * auVar146._12_4_;
                    auVar181 = vsubps_avx(auVar188,auVar153);
                    auVar146 = vshufps_avx(auVar181,auVar181,0xc9);
                    auVar109 = vshufps_avx(auVar115,auVar115,0xc9);
                    auVar189._0_4_ = auVar109._0_4_ * auVar146._0_4_;
                    auVar189._4_4_ = auVar109._4_4_ * auVar146._4_4_;
                    auVar189._8_4_ = auVar109._8_4_ * auVar146._8_4_;
                    auVar189._12_4_ = auVar109._12_4_ * auVar146._12_4_;
                    auVar146 = vshufps_avx(auVar181,auVar181,0xd2);
                    auVar116._0_4_ = auVar115._0_4_ * auVar146._0_4_;
                    auVar116._4_4_ = auVar115._4_4_ * auVar146._4_4_;
                    auVar116._8_4_ = auVar115._8_4_ * auVar146._8_4_;
                    auVar116._12_4_ = auVar115._12_4_ * auVar146._12_4_;
                    auVar146 = vsubps_avx(auVar189,auVar116);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar109 = vshufps_avx(auVar146,auVar146,0xe9);
                      uVar2 = vmovlps_avx(auVar109);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar146._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = uVar98;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar109 = vshufps_avx(auVar146,auVar146,0xe9);
                      local_900 = vmovlps_avx(auVar109);
                      local_8f8 = auVar146._0_4_;
                      local_8f4 = local_aa0;
                      local_8f0 = 0;
                      local_8ec = uVar98;
                      local_8e8 = (uint)local_ac8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a30.valid = &local_acc;
                      local_a30.geometryUserPtr = pGVar13->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_900;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a80 = fVar198;
                      if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010e997f:
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                            auVar350 = ZEXT1664(auVar350._0_16_);
                            auVar377 = ZEXT1664(auVar377._0_16_);
                            (*p_Var14)(&local_a30);
                            auVar364 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar357 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar284 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a30.valid == 0) goto LAB_010e9a32;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar350 = ZEXT1664(local_a00._0_16_);
                        auVar377 = ZEXT1664(auVar377._0_16_);
                        (*pGVar13->intersectionFilterN)(&local_a30);
                        auVar364 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar357 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar284 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a30.valid != 0) goto LAB_010e997f;
LAB_010e9a32:
                        (ray->super_RayK<1>).tfar = local_a80;
                      }
                    }
                  }
                }
              }
              auVar123 = local_600;
              bVar103 = lVar101 != 0;
              lVar101 = lVar101 + -1;
            } while ((!bVar82) && (bVar103));
            fVar198 = (ray->super_RayK<1>).tfar;
            auVar126._4_4_ = fVar198;
            auVar126._0_4_ = fVar198;
            auVar126._8_4_ = fVar198;
            auVar126._12_4_ = fVar198;
            auVar126._16_4_ = fVar198;
            auVar126._20_4_ = fVar198;
            auVar126._24_4_ = fVar198;
            auVar126._28_4_ = fVar198;
            auVar159 = vcmpps_avx(_local_760,auVar126,2);
            local_600 = vandps_avx(auVar159,local_600);
            auVar123 = auVar123 & auVar159;
            uVar99 = local_640._0_8_;
          } while ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar123 >> 0x7f,0) != '\0') ||
                     (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar123 >> 0xbf,0) != '\0') ||
                   (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar123[0x1f] < '\0');
        }
        auVar123 = vandps_avx(local_6c0,local_580);
        auVar159 = vandps_avx(_local_7a0,_local_780);
        auVar284 = ZEXT3264(_local_820);
        auVar197._0_4_ = local_820._0_4_ + local_460._0_4_;
        auVar197._4_4_ = local_820._4_4_ + local_460._4_4_;
        auVar197._8_4_ = local_820._8_4_ + local_460._8_4_;
        auVar197._12_4_ = local_820._12_4_ + local_460._12_4_;
        auVar197._16_4_ = local_820._16_4_ + local_460._16_4_;
        auVar197._20_4_ = local_820._20_4_ + local_460._20_4_;
        auVar197._24_4_ = local_820._24_4_ + local_460._24_4_;
        auVar197._28_4_ = local_820._28_4_ + local_460._28_4_;
        fVar198 = (ray->super_RayK<1>).tfar;
        auVar232._4_4_ = fVar198;
        auVar232._0_4_ = fVar198;
        auVar232._8_4_ = fVar198;
        auVar232._12_4_ = fVar198;
        auVar232._16_4_ = fVar198;
        auVar232._20_4_ = fVar198;
        auVar232._24_4_ = fVar198;
        auVar232._28_4_ = fVar198;
        auVar17 = vcmpps_avx(auVar197,auVar232,2);
        auVar123 = vandps_avx(auVar17,auVar123);
        auVar262._0_4_ = local_820._0_4_ + local_4a0._0_4_;
        auVar262._4_4_ = local_820._4_4_ + local_4a0._4_4_;
        auVar262._8_4_ = local_820._8_4_ + local_4a0._8_4_;
        auVar262._12_4_ = local_820._12_4_ + local_4a0._12_4_;
        auVar262._16_4_ = local_820._16_4_ + local_4a0._16_4_;
        auVar262._20_4_ = local_820._20_4_ + local_4a0._20_4_;
        auVar262._24_4_ = local_820._24_4_ + local_4a0._24_4_;
        auVar262._28_4_ = local_820._28_4_ + local_4a0._28_4_;
        auVar17 = vcmpps_avx(auVar262,auVar232,2);
        auVar159 = vandps_avx(auVar17,auVar159);
        auVar159 = vorps_avx(auVar123,auVar159);
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0x7f,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0xbf,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar159[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar159;
          auVar123 = vblendvps_avx(_local_4a0,local_460,auVar123);
          *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar123;
          auVar314 = ZEXT1664(local_910);
          *(long *)(afStack_140 + uVar97 * 0x18) = local_910._0_8_;
          auStack_138[uVar97 * 0x18] = (int)uVar99 + 1;
          uVar97 = (ulong)((int)uVar97 + 1);
          auVar264 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_010e828d;
        }
        auVar261._8_4_ = 0x3f800000;
        auVar261._0_8_ = &DAT_3f8000003f800000;
        auVar261._12_4_ = 0x3f800000;
        auVar261._16_4_ = 0x3f800000;
        auVar261._20_4_ = 0x3f800000;
        auVar261._24_4_ = 0x3f800000;
        auVar261._28_4_ = 0x3f800000;
      }
      auVar264 = ZEXT3264(auVar261);
      auVar314 = ZEXT1664(local_910);
    }
LAB_010e828d:
    fVar198 = (ray->super_RayK<1>).tfar;
    auVar121._4_4_ = fVar198;
    auVar121._0_4_ = fVar198;
    auVar121._8_4_ = fVar198;
    auVar121._12_4_ = fVar198;
    auVar121._16_4_ = fVar198;
    auVar121._20_4_ = fVar198;
    auVar121._24_4_ = fVar198;
    auVar121._28_4_ = fVar198;
    do {
      if ((int)uVar97 == 0) {
        fVar198 = (ray->super_RayK<1>).tfar;
        auVar129._4_4_ = fVar198;
        auVar129._0_4_ = fVar198;
        auVar129._8_4_ = fVar198;
        auVar129._12_4_ = fVar198;
        auVar129._16_4_ = fVar198;
        auVar129._20_4_ = fVar198;
        auVar129._24_4_ = fVar198;
        auVar129._28_4_ = fVar198;
        auVar123 = vcmpps_avx(local_2a0,auVar129,2);
        uVar98 = vmovmskps_avx(auVar123);
        uVar98 = (uint)local_7a8 & uVar98;
        if (uVar98 == 0) {
          return;
        }
        goto LAB_010e71d1;
      }
      uVar102 = (ulong)((int)uVar97 - 1);
      lVar101 = uVar102 * 0x60;
      auVar123 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar164._0_4_ = auVar284._0_4_ + auVar123._0_4_;
      auVar164._4_4_ = auVar284._4_4_ + auVar123._4_4_;
      auVar164._8_4_ = auVar284._8_4_ + auVar123._8_4_;
      auVar164._12_4_ = auVar284._12_4_ + auVar123._12_4_;
      auVar164._16_4_ = auVar284._16_4_ + auVar123._16_4_;
      auVar164._20_4_ = auVar284._20_4_ + auVar123._20_4_;
      auVar164._24_4_ = auVar284._24_4_ + auVar123._24_4_;
      auVar164._28_4_ = auVar284._28_4_ + auVar123._28_4_;
      auVar17 = vcmpps_avx(auVar164,auVar121,2);
      auVar159 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar101));
      local_460 = auVar159;
      auVar17 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar17;
      bVar88 = (auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar89 = (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar87 = (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar86 = SUB321(auVar17 >> 0x7f,0) == '\0';
      bVar85 = (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar84 = SUB321(auVar17 >> 0xbf,0) == '\0';
      bVar103 = (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar82 = -1 < auVar17[0x1f];
      if (((((((!bVar88 || !bVar89) || !bVar87) || !bVar86) || !bVar85) || !bVar84) || !bVar103) ||
          !bVar82) {
        auVar211._8_4_ = 0x7f800000;
        auVar211._0_8_ = 0x7f8000007f800000;
        auVar211._12_4_ = 0x7f800000;
        auVar211._16_4_ = 0x7f800000;
        auVar211._20_4_ = 0x7f800000;
        auVar211._24_4_ = 0x7f800000;
        auVar211._28_4_ = 0x7f800000;
        auVar123 = vblendvps_avx(auVar211,auVar123,auVar159);
        auVar17 = vshufps_avx(auVar123,auVar123,0xb1);
        auVar17 = vminps_avx(auVar123,auVar17);
        auVar18 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar18 = vperm2f128_avx(auVar17,auVar17,1);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar123 = vcmpps_avx(auVar123,auVar17,0);
        auVar17 = auVar159 & auVar123;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          auVar159 = vandps_avx(auVar123,auVar159);
        }
        fVar198 = afStack_140[uVar102 * 0x18 + 1];
        uVar99 = (ulong)auStack_138[uVar102 * 0x18];
        uVar100 = vmovmskps_avx(auVar159);
        uVar15 = 0;
        if (uVar100 != 0) {
          for (; (uVar100 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        fVar212 = afStack_140[uVar102 * 0x18];
        *(undefined4 *)(local_460 + (ulong)uVar15 * 4) = 0;
        if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_460 >> 0x7f,0) != '\0') ||
              (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_460 >> 0xbf,0) != '\0') ||
            (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_460[0x1f] < '\0') {
          uVar102 = uVar97;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar101) = local_460;
        auVar146 = vshufps_avx(ZEXT416((uint)(fVar198 - fVar212)),ZEXT416((uint)(fVar198 - fVar212))
                               ,0);
        local_4a0._4_4_ = fVar212 + auVar146._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar212 + auVar146._0_4_ * 0.0;
        fStack_498 = fVar212 + auVar146._8_4_ * 0.2857143;
        fStack_494 = fVar212 + auVar146._12_4_ * 0.42857146;
        fStack_490 = fVar212 + auVar146._0_4_ * 0.5714286;
        fStack_48c = fVar212 + auVar146._4_4_ * 0.71428573;
        fStack_488 = fVar212 + auVar146._8_4_ * 0.8571429;
        fStack_484 = fVar212 + auVar146._12_4_;
        auVar314 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar15 * 4));
      }
      uVar97 = uVar102;
    } while (((((((bVar88 && bVar89) && bVar87) && bVar86) && bVar85) && bVar84) && bVar103) &&
             bVar82);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }